

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O2

Value * __thiscall
anon_unknown.dwarf_14d1f4e::Target::Dump(Value *__return_storage_ptr__,Target *this)

{
  _Link_type __rhs;
  _Link_type __rhs_00;
  _Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true> *__key;
  size_type *psVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
  *this_00;
  _Rb_tree_header *p_Var2;
  size_t *psVar3;
  unordered_map<(anonymous_namespace)::CompileData,_unsigned_int,_std::hash<(anonymous_namespace)::CompileData>,_std::equal_to<(anonymous_namespace)::CompileData>,_std::allocator<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>_>
  *this_01;
  __node_base_ptr *pp_Var4;
  __node_base *p_Var5;
  pointer *ppSVar6;
  size_type *psVar7;
  pointer *ppCVar8;
  Comments *__k;
  uint uVar9;
  UInt value;
  cmMakefile *pcVar10;
  cmInstallTargetGenerator *this_02;
  pointer __first;
  pointer __last;
  pointer pcVar11;
  pointer pSVar12;
  pointer __first_00;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pBVar13;
  BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pBVar14;
  pointer pCVar15;
  _Hash_node_base _Var16;
  _Hash_node_base *p_Var17;
  pointer __first_01;
  pointer pSVar18;
  pointer pcVar19;
  __normal_iterator<const_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __last_00;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar20;
  undefined1 auVar21 [16];
  undefined8 uVar22;
  pointer ppcVar23;
  pointer ppcVar24;
  pointer pbVar25;
  size_type sVar26;
  bool bVar27;
  __type _Var28;
  TargetType targetType;
  JBTIndex *__cur;
  TargetType TVar29;
  string *psVar31;
  Value *pVVar32;
  cmLocalGenerator *pcVar33;
  string *psVar34;
  vector<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_> *__x;
  OutputInfo *pOVar35;
  cmValue cVar36;
  cmGlobalGenerator *this_03;
  TargetDependSet *pTVar37;
  _Base_ptr p_Var38;
  iterator iVar39;
  _Rb_tree_node_base *p_Var40;
  _Rb_tree_node_base *p_Var41;
  JBTIndex JVar30;
  ArrayIndex value_00;
  _Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
  *p_Var42;
  pointer pIVar43;
  pointer pIVar44;
  pointer pIVar45;
  long lVar46;
  BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pBVar47;
  pointer pJVar48;
  _Base_ptr p_Var49;
  _Base_ptr p_Var50;
  undefined8 uVar51;
  KindedSources *pKVar52;
  cmSourceGroup *pcVar53;
  _Node_iterator_base<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false> _Var54;
  pointer __result;
  pointer pSVar55;
  pointer pSVar56;
  CompileData *__k_00;
  Target *__result_00;
  iterator iVar57;
  _Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *p_Var58;
  pointer pJVar59;
  pointer pJVar60;
  pointer pJVar61;
  __hash_code _Var62;
  __node_ptr p_Var63;
  __node_ptr p_Var64;
  undefined8 *puVar65;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var66;
  ulong uVar67;
  pointer __result_01;
  pointer pCVar68;
  pointer pCVar69;
  _Base_ptr p_Var70;
  __normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  this_04;
  size_t sVar71;
  JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pJVar72;
  pointer __buffer_size;
  _Tp_alloc_type *__alloc;
  _Tp_alloc_type *__alloc_00;
  cmGeneratorTarget *pcVar73;
  cmSourceFile *pcVar74;
  _Hash_node_base _Var75;
  _Tp_alloc_type *__alloc_01;
  pointer pCVar76;
  allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *paVar77;
  __normal_iterator<const_(anonymous_namespace)::CompileData::IncludeEntry_*,_std::vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>_>
  __last_01;
  __normal_iterator<const_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  _Var78;
  ArrayIndex extraout_EDX;
  ArrayIndex extraout_EDX_00;
  JBTIndex bt;
  JBTIndex bt_00;
  string *path_00;
  string *path_01;
  _Base_ptr p_Var79;
  size_t __n;
  SourceGroup *__args;
  SourceGroup *__args_00;
  SourceGroup *extraout_RDX;
  ulong uVar80;
  CompileGroup *__args_01;
  CompileGroup *__args_02;
  CompileGroup *extraout_RDX_00;
  size_t __n_01;
  size_t __n_02;
  string *extraout_RDX_01;
  string *extraout_RDX_02;
  JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *d;
  ValueHolder bt_01;
  Target *pTVar81;
  pointer pSVar82;
  pointer this_05;
  undefined8 uVar83;
  undefined1 auVar84 [8];
  __node_base _Var85;
  iterator __pos;
  undefined1 *puVar86;
  JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pJVar87;
  _Link_type __p;
  pointer bt_02;
  cmListFileBacktrace *__n_03;
  allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__n_04;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar88;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pBVar89;
  __normal_iterator<const_(anonymous_namespace)::CompileData::IncludeEntry_*,_std::vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>_>
  __first_02;
  _Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
  *this_06;
  _Base_ptr p_Var90;
  pointer __rhs_01;
  pointer arch;
  _Alloc_hider _Var91;
  pointer ppcVar92;
  pointer ppcVar93;
  pointer __p_00;
  ulong uVar94;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar95;
  pair<std::__detail::_Node_iterator<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false,_false>,_bool>
  pVar96;
  undefined1 auVar97 [16];
  string p;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_618 [2];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configFileDefines;
  Value artifact;
  undefined8 uStack_5a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_598;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_588;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_578;
  __node_base local_568;
  _Base_ptr p_Stack_560;
  pointer local_558;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_550;
  undefined1 local_540 [8];
  undefined1 local_538 [24];
  undefined1 local_520 [8];
  _Alloc_hider _Stack_518;
  pointer local_510;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_508;
  _Alloc_hider local_4f8;
  cmSourceFile *local_4f0;
  undefined1 local_4e8 [8];
  set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  defines;
  vector<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_> installGens;
  string obj_dir;
  undefined1 auStack_418 [16];
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  architectures;
  string COMPILE_DEFINITIONS;
  Value compileGroups;
  string tmp_1;
  Value local_2e0;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_2b8;
  bool isSystemInclude;
  Value dependencies;
  string COMPILE_OPTIONS;
  Value local_238;
  string path;
  string local_1f0;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_1d0;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_1c0;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_1b0;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  string COMPILE_FLAGS;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  size_type __n_00;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  targetType = cmGeneratorTarget::GetType(this->GT);
  psVar31 = cmGeneratorTarget::GetName_abi_cxx11_(this->GT);
  Json::Value::Value(&artifact,psVar31);
  pVVar32 = Json::Value::operator[](__return_storage_ptr__,"name");
  Json::Value::operator=(pVVar32,&artifact);
  Json::Value::~Value(&artifact);
  psVar31 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
  Json::Value::Value(&artifact,psVar31);
  pVVar32 = Json::Value::operator[](__return_storage_ptr__,"type");
  Json::Value::operator=(pVVar32,&artifact);
  Json::Value::~Value(&artifact);
  psVar31 = &this->TopBuild;
  TargetId((string *)&defines,this->GT,psVar31);
  Json::Value::Value(&artifact,(String *)&defines);
  pVVar32 = Json::Value::operator[](__return_storage_ptr__,"id");
  Json::Value::operator=(pVVar32,&artifact);
  Json::Value::~Value(&artifact);
  std::__cxx11::string::~string((string *)&defines);
  Json::Value::Value((Value *)&defines,objectValue);
  pcVar33 = cmGeneratorTarget::GetLocalGenerator(this->GT);
  psVar34 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_(pcVar33);
  cmSystemTools::RelativeIfUnder(&p,&this->TopSource,psVar34);
  Json::Value::Value(&artifact,&p);
  pVVar32 = Json::Value::operator[]((Value *)&defines,"source");
  Json::Value::operator=(pVVar32,&artifact);
  Json::Value::~Value(&artifact);
  std::__cxx11::string::~string((string *)&p);
  psVar34 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar33);
  cmSystemTools::RelativeIfUnder(&p,psVar31,psVar34);
  Json::Value::Value(&artifact,&p);
  pVVar32 = Json::Value::operator[]((Value *)&defines,"build");
  Json::Value::operator=(pVVar32,&artifact);
  Json::Value::~Value(&artifact);
  std::__cxx11::string::~string((string *)&p);
  pVVar32 = Json::Value::operator[](__return_storage_ptr__,"paths");
  Json::Value::operator=(pVVar32,(Value *)&defines);
  Json::Value::~Value((Value *)&defines);
  bVar27 = cmTarget::GetIsGeneratorProvided(this->GT->Target);
  if (bVar27) {
    Json::Value::Value(&artifact,true);
    pVVar32 = Json::Value::operator[](__return_storage_ptr__,"isGeneratorProvided");
    Json::Value::operator=(pVVar32,&artifact);
    Json::Value::~Value(&artifact);
  }
  cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)&artifact);
  AddBacktrace(this,__return_storage_ptr__,(cmListFileBacktrace *)&artifact);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&artifact.bits_);
  bVar27 = cmTarget::GetHaveInstallRule(this->GT->Target);
  if (bVar27) {
    Json::Value::Value((Value *)&obj_dir,objectValue);
    Json::Value::Value((Value *)&defines,objectValue);
    pcVar10 = this->GT->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&artifact,"CMAKE_INSTALL_PREFIX",(allocator<char> *)&configFileDefines);
    psVar34 = cmMakefile::GetSafeDefinition(pcVar10,(string *)&artifact);
    std::__cxx11::string::string((string *)&p,(string *)psVar34);
    std::__cxx11::string::~string((string *)&artifact);
    cmsys::SystemTools::ConvertToUnixSlashes(&p);
    Json::Value::Value(&artifact,&p);
    pVVar32 = Json::Value::operator[]((Value *)&defines,"path");
    Json::Value::operator=(pVVar32,&artifact);
    Json::Value::~Value(&artifact);
    std::__cxx11::string::~string((string *)&p);
    pVVar32 = Json::Value::operator[]((Value *)&obj_dir,"prefix");
    Json::Value::operator=(pVVar32,(Value *)&defines);
    Json::Value::~Value((Value *)&defines);
    Json::Value::Value((Value *)&p,arrayValue);
    __x = cmTarget::GetInstallGenerators(this->GT->Target);
    std::vector<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>::vector
              (&installGens,__x);
    ppcVar23 = installGens.
               super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    for (ppcVar92 = installGens.
                    super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppcVar92 != ppcVar23;
        ppcVar92 = ppcVar92 + 1) {
      this_02 = *ppcVar92;
      Json::Value::Value((Value *)&defines,objectValue);
      cmInstallTargetGenerator::GetDestination((string *)&configFileDefines,this_02,this->Config);
      Json::Value::Value(&artifact,(string *)&configFileDefines);
      pVVar32 = Json::Value::operator[]((Value *)&defines,"path");
      Json::Value::operator=(pVVar32,&artifact);
      Json::Value::~Value(&artifact);
      std::__cxx11::string::~string((string *)&configFileDefines);
      AddBacktrace(this,(Value *)&defines,&(this_02->super_cmInstallGenerator).Backtrace);
      Json::Value::append((Value *)&p,(Value *)&defines);
      Json::Value::~Value((Value *)&defines);
    }
    std::_Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>::
    ~_Vector_base(&installGens.
                   super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                 );
    pVVar32 = Json::Value::operator[]((Value *)&obj_dir,"destinations");
    Json::Value::operator=(pVVar32,(Value *)&p);
    Json::Value::~Value((Value *)&p);
    pVVar32 = Json::Value::operator[](__return_storage_ptr__,"install");
    Json::Value::operator=(pVVar32,(Value *)&obj_dir);
    Json::Value::~Value((Value *)&obj_dir);
  }
  bVar27 = cmGeneratorTarget::HaveWellDefinedOutputFiles(this->GT);
  if (bVar27) {
    Json::Value::Value((Value *)&p,arrayValue);
    TVar29 = cmGeneratorTarget::GetType(this->GT);
    if (TVar29 == OBJECT_LIBRARY) {
      bVar27 = cmTarget::HasKnownObjectFileLocation(this->GT->Target,(string *)0x0);
      if (bVar27) {
        objectSources.
        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        objectSources.
        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        objectSources.
        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        cmGeneratorTarget::GetObjectSources(this->GT,&objectSources,this->Config);
        cmGeneratorTarget::GetObjectDirectory(&obj_dir,this->GT,this->Config);
        ppcVar24 = objectSources.
                   super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        for (ppcVar93 = objectSources.
                        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppcVar93 != ppcVar24;
            ppcVar93 = ppcVar93 + 1) {
          psVar34 = cmGeneratorTarget::GetObjectName_abi_cxx11_(this->GT,*ppcVar93);
          Json::Value::Value(&artifact,objectValue);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &installGens,&obj_dir,psVar34);
          cmSystemTools::RelativeIfUnder
                    ((string *)&configFileDefines,psVar31,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &installGens);
          Json::Value::Value((Value *)&defines,(string *)&configFileDefines);
          pVVar32 = Json::Value::operator[](&artifact,"path");
          Json::Value::operator=(pVVar32,(Value *)&defines);
          Json::Value::~Value((Value *)&defines);
          std::__cxx11::string::~string((string *)&configFileDefines);
          std::__cxx11::string::~string((string *)&installGens);
          Json::Value::append((Value *)&p,&artifact);
          Json::Value::~Value(&artifact);
        }
        std::__cxx11::string::~string((string *)&obj_dir);
        std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::
        ~_Vector_base(&objectSources.
                       super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                     );
      }
    }
    else {
      Json::Value::Value(&artifact,objectValue);
      cmGeneratorTarget::GetFullPath
                ((string *)&configFileDefines,this->GT,this->Config,RuntimeBinaryArtifact,false);
      cmSystemTools::RelativeIfUnder(&obj_dir,psVar31,(string *)&configFileDefines);
      Json::Value::Value((Value *)&defines,&obj_dir);
      pVVar32 = Json::Value::operator[](&artifact,"path");
      Json::Value::operator=(pVVar32,(Value *)&defines);
      Json::Value::~Value((Value *)&defines);
      std::__cxx11::string::~string((string *)&obj_dir);
      std::__cxx11::string::~string((string *)&configFileDefines);
      Json::Value::append((Value *)&p,&artifact);
      Json::Value::~Value(&artifact);
      bVar27 = cmGeneratorTarget::HasImportLibrary(this->GT,this->Config);
      if (bVar27) {
        Json::Value::Value(&artifact,objectValue);
        cmGeneratorTarget::GetFullPath
                  ((string *)&configFileDefines,this->GT,this->Config,ImportLibraryArtifact,false);
        cmSystemTools::RelativeIfUnder(&obj_dir,psVar31,(string *)&configFileDefines);
        Json::Value::Value((Value *)&defines,&obj_dir);
        pVVar32 = Json::Value::operator[](&artifact,"path");
        Json::Value::operator=(pVVar32,(Value *)&defines);
        Json::Value::~Value((Value *)&defines);
        std::__cxx11::string::~string((string *)&obj_dir);
        std::__cxx11::string::~string((string *)&configFileDefines);
        Json::Value::append((Value *)&p,&artifact);
        Json::Value::~Value(&artifact);
      }
      bVar27 = cmGeneratorTarget::IsDLLPlatform(this->GT);
      if ((((bVar27) && (TVar29 = cmGeneratorTarget::GetType(this->GT), TVar29 != STATIC_LIBRARY))
          && (pOVar35 = cmGeneratorTarget::GetOutputInfo(this->GT,this->Config),
             pOVar35 != (OutputInfo *)0x0)) && ((pOVar35->PdbDir)._M_string_length != 0)) {
        Json::Value::Value(&artifact,objectValue);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &installGens,&pOVar35->PdbDir,'/');
        cmGeneratorTarget::GetPDBName((string *)&objectSources,this->GT,this->Config);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &configFileDefines,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &installGens,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &objectSources);
        cmSystemTools::RelativeIfUnder(&obj_dir,psVar31,(string *)&configFileDefines);
        Json::Value::Value((Value *)&defines,&obj_dir);
        pVVar32 = Json::Value::operator[](&artifact,"path");
        Json::Value::operator=(pVVar32,(Value *)&defines);
        Json::Value::~Value((Value *)&defines);
        std::__cxx11::string::~string((string *)&obj_dir);
        std::__cxx11::string::~string((string *)&configFileDefines);
        std::__cxx11::string::~string((string *)&objectSources);
        std::__cxx11::string::~string((string *)&installGens);
        Json::Value::append((Value *)&p,&artifact);
        Json::Value::~Value(&artifact);
      }
    }
    bVar27 = Json::Value::empty((Value *)&p);
    if (!bVar27) {
      pVVar32 = Json::Value::operator[](__return_storage_ptr__,"artifacts");
      Json::Value::operator=(pVVar32,(Value *)&p);
    }
    Json::Value::~Value((Value *)&p);
  }
  if (targetType - SHARED_LIBRARY < 2) {
LAB_003b39aa:
    cmGeneratorTarget::GetFullName((string *)&defines,this->GT,this->Config,RuntimeBinaryArtifact);
    Json::Value::Value(&artifact,(String *)&defines);
    pVVar32 = Json::Value::operator[](__return_storage_ptr__,"nameOnDisk");
    Json::Value::operator=(pVVar32,&artifact);
    Json::Value::~Value(&artifact);
    std::__cxx11::string::~string((string *)&defines);
    Json::Value::Value((Value *)&defines,objectValue);
    cmGeneratorTarget::GetLinkerLanguage(&p,this->GT,this->Config);
    Json::Value::Value(&artifact,&p);
    pVVar32 = Json::Value::operator[]((Value *)&defines,"language");
    Json::Value::operator=(pVVar32,&artifact);
    Json::Value::~Value(&artifact);
    DumpLinkCommandFragments(&artifact,this);
    bVar27 = Json::Value::empty(&artifact);
    if (!bVar27) {
      pVVar32 = Json::Value::operator[]((Value *)&defines,"commandFragments");
      Json::Value::operator=(pVVar32,&artifact);
    }
    Json::Value::~Value(&artifact);
    pcVar10 = this->GT->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&artifact,"CMAKE_SYSROOT_LINK",(allocator<char> *)&obj_dir);
    cVar36 = cmMakefile::GetDefinition(pcVar10,(string *)&artifact);
    std::__cxx11::string::~string((string *)&artifact);
    if (cVar36.Value == (string *)0x0) {
      pcVar10 = this->GT->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&artifact,"CMAKE_SYSROOT",(allocator<char> *)&obj_dir);
      cVar36 = cmMakefile::GetDefinition(pcVar10,(string *)&artifact);
      std::__cxx11::string::~string((string *)&artifact);
      if (cVar36.Value != (string *)0x0) {
        DumpSysroot(&artifact,(Target *)cVar36.Value,path_01);
        pVVar32 = Json::Value::operator[]((Value *)&defines,"sysroot");
        goto LAB_003b3bb2;
      }
    }
    else {
      DumpSysroot(&artifact,(Target *)cVar36.Value,path_00);
      pVVar32 = Json::Value::operator[]((Value *)&defines,"sysroot");
LAB_003b3bb2:
      Json::Value::operator=(pVVar32,&artifact);
      Json::Value::~Value(&artifact);
    }
    bVar27 = cmGeneratorTarget::IsIPOEnabled(this->GT,&p,this->Config);
    if (bVar27) {
      Json::Value::Value(&artifact,true);
      pVVar32 = Json::Value::operator[]((Value *)&defines,"lto");
      Json::Value::operator=(pVVar32,&artifact);
      Json::Value::~Value(&artifact);
    }
    std::__cxx11::string::~string((string *)&p);
    pVVar32 = Json::Value::operator[](__return_storage_ptr__,"link");
  }
  else {
    if (targetType != STATIC_LIBRARY) {
      if (targetType != EXECUTABLE) goto LAB_003b3db3;
      goto LAB_003b39aa;
    }
    cmGeneratorTarget::GetFullName((string *)&defines,this->GT,this->Config,RuntimeBinaryArtifact);
    Json::Value::Value(&artifact,(String *)&defines);
    pVVar32 = Json::Value::operator[](__return_storage_ptr__,"nameOnDisk");
    Json::Value::operator=(pVVar32,&artifact);
    Json::Value::~Value(&artifact);
    std::__cxx11::string::~string((string *)&defines);
    Json::Value::Value((Value *)&defines,objectValue);
    DumpLinkCommandFragments(&artifact,this);
    bVar27 = Json::Value::empty(&artifact);
    if (!bVar27) {
      pVVar32 = Json::Value::operator[]((Value *)&defines,"commandFragments");
      Json::Value::operator=(pVVar32,&artifact);
    }
    Json::Value::~Value(&artifact);
    cmGeneratorTarget::GetLinkerLanguage(&p,this->GT,this->Config);
    bVar27 = cmGeneratorTarget::IsIPOEnabled(this->GT,&p,this->Config);
    if (bVar27) {
      Json::Value::Value(&artifact,true);
      pVVar32 = Json::Value::operator[]((Value *)&defines,"lto");
      Json::Value::operator=(pVVar32,&artifact);
      Json::Value::~Value(&artifact);
    }
    std::__cxx11::string::~string((string *)&p);
    pVVar32 = Json::Value::operator[](__return_storage_ptr__,"archive");
  }
  Json::Value::operator=(pVVar32,(Value *)&defines);
  Json::Value::~Value((Value *)&defines);
LAB_003b3db3:
  Json::Value::Value(&dependencies,arrayValue);
  this_03 = cmGeneratorTarget::GetGlobalGenerator(this->GT);
  pTVar37 = cmGlobalGenerator::GetTargetDirectDepends(this_03,this->GT);
  for (p_Var38 = (pTVar37->
                 super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                 )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var38 !=
      &(pTVar37->
       super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>)._M_t.
       _M_impl.super__Rb_tree_header; p_Var38 = (_Base_ptr)std::_Rb_tree_increment(p_Var38)) {
    Json::Value::Value((Value *)&defines,objectValue);
    TargetId(&p,*(cmGeneratorTarget **)(p_Var38 + 1),psVar31);
    Json::Value::Value(&artifact,&p);
    pVVar32 = Json::Value::operator[]((Value *)&defines,"id");
    Json::Value::operator=(pVVar32,&artifact);
    Json::Value::~Value(&artifact);
    std::__cxx11::string::~string((string *)&p);
    AddBacktrace(this,(Value *)&defines,(cmListFileBacktrace *)&p_Var38[1]._M_left);
    Json::Value::append(&dependencies,(Value *)&defines);
    Json::Value::~Value((Value *)&defines);
  }
  bVar27 = Json::Value::empty(&dependencies);
  if (!bVar27) {
    pVVar32 = Json::Value::operator[](__return_storage_ptr__,"dependencies");
    Json::Value::operator=(pVVar32,&dependencies);
  }
  p.field_2._8_8_ = &p._M_string_length;
  p._M_string_length._0_4_ = 0;
  p.field_2._M_allocated_capacity = 0;
  local_618[0]._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_618[0]._M_ptr = (element_type *)p.field_2._8_8_;
  cmGeneratorTarget::GetLanguages
            (this->GT,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&p,this->Config);
  this_00 = &this->CompileDataMap;
  p_Var2 = &(this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header;
  uVar51 = p.field_2._8_8_;
  do {
    if ((size_type *)uVar51 == &p._M_string_length) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&p);
      Json::Value::Value(&local_2e0,arrayValue);
      pKVar52 = cmGeneratorTarget::GetKindedSources(this->GT,this->Config);
      auStack_418._8_8_ =
           (pKVar52->Sources).
           super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
           ._M_impl.super__Vector_impl_data._M_start;
      pSVar12 = (pKVar52->Sources).
                super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      this_01 = &this->CompileGroupMap;
      pp_Var4 = &(this->CompileGroupMap)._M_h._M_single_bucket;
      p_Var5 = &(this->CompileGroupMap)._M_h._M_before_begin;
      do {
        if ((pointer)auStack_418._8_8_ == pSVar12) {
          pVVar32 = Json::Value::operator[](__return_storage_ptr__,"sources");
          Json::Value::operator=(pVVar32,&local_2e0);
          Json::Value::~Value(&local_2e0);
          Json::Value::Value((Value *)&installGens,nullValue);
          pcVar73 = this->GT;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&artifact,"FOLDER",(allocator<char> *)&defines);
          cVar36 = cmGeneratorTarget::GetProperty(pcVar73,(string *)&artifact);
          std::__cxx11::string::~string((string *)&artifact);
          if (cVar36.Value != (string *)0x0) {
            Json::Value::Value(&artifact,objectValue);
            Json::Value::operator=((Value *)&installGens,&artifact);
            Json::Value::~Value(&artifact);
            Json::Value::Value(&artifact,cVar36.Value);
            pVVar32 = Json::Value::operator[]((Value *)&installGens,"name");
            Json::Value::operator=(pVVar32,&artifact);
            Json::Value::~Value(&artifact);
          }
          bVar27 = Json::Value::isNull((Value *)&installGens);
          if (!bVar27) {
            pVVar32 = Json::Value::operator[](__return_storage_ptr__,"folder");
            Json::Value::operator=(pVVar32,(Value *)&installGens);
          }
          Json::Value::Value((Value *)&objectSources,arrayValue);
          pSVar18 = (this->SourceGroups).
                    super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (pSVar82 = (this->SourceGroups).
                         super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                         ._M_impl.super__Vector_impl_data._M_start; pSVar82 != pSVar18;
              pSVar82 = pSVar82 + 1) {
            Json::Value::Value((Value *)&defines,objectValue);
            Json::Value::Value(&artifact,&pSVar82->Name);
            pVVar32 = Json::Value::operator[]((Value *)&defines,"name");
            Json::Value::operator=(pVVar32,&artifact);
            Json::Value::~Value(&artifact);
            pVVar32 = Json::Value::operator[]((Value *)&defines,"sourceIndexes");
            Json::Value::operator=(pVVar32,&pSVar82->SourceIndexes);
            Json::Value::append((Value *)&objectSources,(Value *)&defines);
            Json::Value::~Value((Value *)&defines);
          }
          bVar27 = Json::Value::empty((Value *)&objectSources);
          if (!bVar27) {
            pVVar32 = Json::Value::operator[](__return_storage_ptr__,"sourceGroups");
            Json::Value::operator=(pVVar32,(Value *)&objectSources);
          }
          Json::Value::Value(&compileGroups,arrayValue);
          pCVar76 = (this->CompileGroups).
                    super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pCVar15 = (this->CompileGroups).
                    super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          do {
            if (pCVar76 == pCVar15) {
              bVar27 = Json::Value::empty(&compileGroups);
              if (!bVar27) {
                pVVar32 = Json::Value::operator[](__return_storage_ptr__,"compileGroups");
                Json::Value::operator=(pVVar32,&compileGroups);
              }
              Json::Value::~Value(&compileGroups);
              Json::Value::~Value((Value *)&objectSources);
              Json::Value::~Value((Value *)&installGens);
              BacktraceData::Dump(&artifact,&this->Backtraces);
              pVVar32 = Json::Value::operator[](__return_storage_ptr__,"backtraceGraph");
              Json::Value::operator=(pVVar32,&artifact);
              Json::Value::~Value(&artifact);
              Json::Value::~Value(&dependencies);
              return __return_storage_ptr__;
            }
            pcVar19 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pCVar76->Entry)->_M_dataplus)._M_p;
            _Var78._M_current =
                 (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)pCVar76;
            CompileData::CompileData((CompileData *)&artifact);
            std::__cxx11::string::_M_assign((string *)&artifact);
            if (artifact._8_8_ != 0) {
              iVar39 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
                       ::lower_bound(this_00,(key_type *)&artifact);
              if (((_Rb_tree_header *)iVar39._M_node == p_Var2) ||
                 (bVar27 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&artifact,
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)(iVar39._M_node + 1)), bVar27)) {
                std::__throw_out_of_range("map::at");
              }
              std::__cxx11::string::_M_assign((string *)&artifact.limit_);
              if (&iVar39._M_node[7]._M_parent != (_Base_ptr *)local_520) {
                _Var78._M_current =
                     (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)iVar39._M_node[7]._M_parent;
                __last_00._M_current =
                     (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)iVar39._M_node[7]._M_left;
                __n_04 = (allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)((long)__last_00._M_current - (long)_Var78._M_current);
                paVar77 = (allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)local_510 - (long)local_520);
                if (paVar77 < __n_04) {
                  local_4e8 = (undefined1  [8])((long)__n_04 / 0x28);
                  pBVar47 = (BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)std::
                               _Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ::_M_allocate((_Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              *)((long)__n_04 / 0x28),(size_t)__n_04);
                  std::
                  __uninitialized_copy_a<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>const*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,(anonymous_namespace)::JBT<std::__cxx11::string>*,(anonymous_namespace)::JBT<std::__cxx11::string>>
                            (_Var78,__last_00,
                             (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)pBVar47,paVar77);
                  std::_Destroy<(anonymous_namespace)::JBT<std::__cxx11::string>*>
                            ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_520,
                             (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)_Stack_518._M_p);
                  std::
                  _Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::_M_deallocate((_Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_520,(pointer)(((long)local_510 - (long)local_520) / 0x28)
                                  ,((long)local_510 - (long)local_520) % 0x28);
                  local_510 = (pointer)((long)pBVar47 + (long)__n_04);
                  local_520 = (undefined1  [8])pBVar47;
                }
                else if ((allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(_Stack_518._M_p + -(long)local_520) < __n_04) {
                  auVar84 = local_520;
                  for (lVar46 = (long)(_Stack_518._M_p + -(long)local_520) / 0x28; 0 < lVar46;
                      lVar46 = lVar46 + -1) {
                    JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator=((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)auVar84,_Var78._M_current);
                    _Var78._M_current = _Var78._M_current + 1;
                    auVar84 = (undefined1  [8])((long)auVar84 + 0x28);
                  }
                  pJVar72 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)iVar39._M_node[7]._M_left;
                  local_4e8 = (undefined1  [8])_Stack_518._M_p;
                  _Var91._M_p = _Stack_518._M_p;
                  for (pJVar87 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)(((long)_Stack_518._M_p - (long)local_520) +
                                    (long)iVar39._M_node[7]._M_parent); pJVar87 != pJVar72;
                      pJVar87 = pJVar87 + 1) {
                    JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::JBT((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)_Var91._M_p,pJVar87);
                    _Var91._M_p = (pointer)&(((BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               *)_Var91._M_p)->Backtraces).
                                            super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>
                                            ._M_impl.super__Vector_impl_data._M_finish;
                  }
                }
                else {
                  this_04 = std::
                            copy<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>const*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>>
                                      (_Var78,__last_00,
                                       (__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                        )local_520);
                  _Var91._M_p = _Stack_518._M_p;
                  for (; this_04._M_current !=
                         (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)_Var91._M_p;
                      this_04._M_current =
                           (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&(((BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)this_04._M_current)->Backtraces).
                               super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>
                               ._M_impl.super__Vector_impl_data._M_finish) {
                    std::__cxx11::string::~string((string *)this_04._M_current);
                  }
                }
                _Stack_518._M_p = (pointer)(__n_04 + (long)local_520);
              }
              paVar88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(iVar39._M_node + 4);
              std::__cxx11::string::_M_assign((string *)local_588._M_local_buf);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(iVar39._M_node + 4) != &local_588) {
                p_Var38 = *(_Base_ptr *)(iVar39._M_node + 5);
                p_Var90 = iVar39._M_node[5]._M_parent;
                uVar80 = (long)p_Var90 - (long)p_Var38;
                if ((ulong)((long)local_558 - (long)local_568._M_nxt) < uVar80) {
                  p_Var70 = (_Base_ptr)
                            std::
                            _Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                            ::_M_allocate((_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                                           *)((long)uVar80 >> 2),(size_t)paVar88);
                  for (lVar46 = 0; p_Var50 = (_Base_ptr)((long)&p_Var38->_M_color + lVar46),
                      p_Var50 != p_Var90; lVar46 = lVar46 + 4) {
                    *(_Rb_tree_color *)
                     ((long)&(((_Vector_impl *)&p_Var70->_M_color)->super__Vector_impl_data).
                             _M_start + lVar46) = p_Var50->_M_color;
                  }
                  std::
                  _Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                  ::_M_deallocate((_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                                   *)local_568._M_nxt,
                                  (pointer)((long)local_558 - (long)local_568._M_nxt >> 2),__n_01);
                  local_558 = (pointer)((long)p_Var70 + uVar80);
                  local_568._M_nxt = (_Hash_node_base *)p_Var70;
                }
                else {
                  __n_02 = (long)p_Stack_560 - (long)local_568._M_nxt;
                  if (__n_02 < uVar80) {
                    if (p_Stack_560 != (_Base_ptr)local_568._M_nxt) {
                      memmove(local_568._M_nxt,p_Var38,__n_02);
                      p_Var38 = *(_Base_ptr *)(iVar39._M_node + 5);
                      p_Var90 = iVar39._M_node[5]._M_parent;
                      __n_02 = (long)p_Stack_560 - (long)local_568._M_nxt;
                    }
                    for (p_Var38 = (_Base_ptr)((long)&p_Var38->_M_color + __n_02);
                        p_Var38 != p_Var90; p_Var38 = (_Base_ptr)&p_Var38->field_0x4) {
                      *(_Rb_tree_color *)
                       &(((_Vector_impl *)&p_Stack_560->_M_color)->super__Vector_impl_data)._M_start
                           = p_Var38->_M_color;
                      p_Stack_560 = (_Base_ptr)&p_Stack_560->field_0x4;
                    }
                  }
                  else if (p_Var90 != p_Var38) {
                    memmove(local_568._M_nxt,p_Var38,uVar80);
                  }
                }
                p_Stack_560 = (_Base_ptr)((long)local_568._M_nxt + uVar80);
              }
              std::
              vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::reserve((vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_550,
                        (*(long *)(iVar39._M_node + 6) - (long)iVar39._M_node[5]._M_right) / 0x28 +
                        (*(long *)(pcVar19 + 0x88) - *(long *)(pcVar19 + 0x80)) / 0x28);
              std::
              vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
              ::
              insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>const*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,void>
                        ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                          *)local_550._M_local_buf,(const_iterator)local_550._8_8_,
                         (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)iVar39._M_node[5]._M_right,
                         *(JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           **)(iVar39._M_node + 6));
              std::
              vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
              ::
              insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>const*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,void>
                        ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                          *)local_550._M_local_buf,(const_iterator)local_550._8_8_,
                         *(JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           **)(pcVar19 + 0x80),
                         *(JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           **)(pcVar19 + 0x88));
              uVar83 = local_508._8_8_;
              uVar51 = local_508._M_allocated_capacity;
              __first_02._M_current = *(IncludeEntry **)(pcVar19 + 200);
              __last_01._M_current = *(IncludeEntry **)(pcVar19 + 0xd0);
              sVar71 = ((long)__last_01._M_current - (long)__first_02._M_current) / 0x30;
              p_Var42 = (_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                         *)(((long)iVar39._M_node[8]._M_parent - *(long *)(iVar39._M_node + 8)) /
                            0x30 + sVar71);
              if ((_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                   *)0x2aaaaaaaaaaaaaa < p_Var42) {
                std::__throw_length_error("vector::reserve");
              }
              if ((_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                   *)(((long)local_4f8._M_p - local_508._0_8_) / 0x30) < p_Var42) {
                pIVar43 = std::
                          _Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                          ::_M_allocate(p_Var42,sVar71);
                std::
                vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                ::_S_relocate((pointer)local_508._M_allocated_capacity,(pointer)local_508._8_8_,
                              pIVar43,(_Tp_alloc_type *)__last_01._M_current);
                std::
                _Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                ::_M_deallocate((_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                                 *)local_508._M_allocated_capacity,
                                (pointer)(((long)local_4f8._M_p - local_508._0_8_) / 0x30),
                                ((long)local_4f8._M_p - local_508._0_8_) % 0x30);
                local_508._8_8_ = (uVar83 - uVar51) + (long)pIVar43;
                local_4f8._M_p = (pointer)(pIVar43 + (long)p_Var42);
                __first_02._M_current = *(IncludeEntry **)(pcVar19 + 200);
                __last_01._M_current = *(IncludeEntry **)(pcVar19 + 0xd0);
                local_508._M_allocated_capacity = (size_type)pIVar43;
              }
              std::
              vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
              ::
              insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::CompileData::IncludeEntry_const*,std::vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>>,void>
                        ((vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
                          *)local_508._M_local_buf,(const_iterator)local_508._8_8_,__first_02,
                         __last_01);
              std::
              vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
              ::
              insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::CompileData::IncludeEntry_const*,std::vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>>,void>
                        ((vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
                          *)local_508._M_local_buf,(const_iterator)local_508._8_8_,
                         *(IncludeEntry **)(iVar39._M_node + 8),
                         (IncludeEntry *)iVar39._M_node[8]._M_parent);
              std::
              vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::reserve((vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_538,
                        ((long)iVar39._M_node[6]._M_right - (long)iVar39._M_node[6]._M_left) / 0x28
                        + (*(long *)(pcVar19 + 0xa0) - *(long *)(pcVar19 + 0x98)) / 0x28);
              std::
              vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
              ::
              insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>const*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,void>
                        ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                          *)local_538,(const_iterator)local_538._8_8_,
                         (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)iVar39._M_node[6]._M_left,
                         (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)iVar39._M_node[6]._M_right);
              _Var78._M_current =
                   *(JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     **)(pcVar19 + 0xa0);
              std::
              vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
              ::
              insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>const*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,void>
                        ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                          *)local_538,(const_iterator)local_538._8_8_,
                         *(JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           **)(pcVar19 + 0x98),_Var78);
              uVar83 = local_538._8_8_;
              uVar51 = local_538._0_8_;
              pJVar59 = (pointer)local_538._0_8_;
              if (local_538._0_8_ != local_538._8_8_) {
                _Var78._M_current =
                     (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x2;
                defines._M_t._M_impl._0_8_ =
                     ((long)(local_538._8_8_ - local_538._0_8_) / 0x28 + 1) / 2;
                defines._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                defines._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                defines._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                __buffer_size = (pointer)defines._M_t._M_impl._0_8_;
LAB_003b6905:
                if ((long)__buffer_size < 1) {
                  std::
                  __inplace_stable_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)((anonymous_namespace)::JBT<std::__cxx11::string>const&,(anonymous_namespace)::JBT<std::__cxx11::string>const&)>>
                            ((__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              )uVar51,(__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       )uVar83,
                             (_Iter_comp_iter<bool_(*)(const_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
                              )0x3ba0c8);
                }
                else {
                  uVar80 = (long)__buffer_size * 0x28;
                  pJVar72 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)operator_new(uVar80,(nothrow_t *)&std::nothrow);
                  if (pJVar72 ==
                      (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x0) goto code_r0x003b6922;
                  JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::JBT(pJVar72,(JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)uVar51);
                  pJVar87 = pJVar72;
                  while (uVar80 = uVar80 - 0x28, uVar80 != 0) {
                    JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::JBT(pJVar87 + 1,pJVar87);
                    pJVar87 = pJVar87 + 1;
                  }
                  JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator=((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)uVar51,pJVar87);
                  defines._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = __buffer_size;
                  defines._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                       (_Base_ptr)pJVar72;
                  std::
                  __stable_sort_adaptive<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,(anonymous_namespace)::JBT<std::__cxx11::string>*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)((anonymous_namespace)::JBT<std::__cxx11::string>const&,(anonymous_namespace)::JBT<std::__cxx11::string>const&)>>
                            ((__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              )uVar51,(__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       )uVar83,pJVar72,(long)__buffer_size,
                             (_Iter_comp_iter<bool_(*)(const_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
                              )0x3ba0c8);
                  _Var78._M_current =
                       (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)__buffer_size;
                }
                std::
                _Temporary_buffer<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~_Temporary_buffer
                          ((_Temporary_buffer<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&defines);
                uVar51 = local_538._8_8_;
                pJVar59 = (pointer)local_538._0_8_;
                __rhs_01 = (pointer)local_538._0_8_;
                if (local_538._0_8_ != local_538._8_8_) {
                  do {
                    this_05 = __rhs_01;
                    __rhs_01 = this_05 + 1;
                    pJVar59 = (pointer)uVar51;
                    if (__rhs_01 == (pointer)uVar51) goto LAB_003b6a26;
                    _Var28 = std::operator==(&this_05->Value,&__rhs_01->Value);
                  } while (!_Var28);
                  while (__rhs_01 = __rhs_01 + 1, __rhs_01 != (pointer)uVar51) {
                    _Var28 = std::operator==(&this_05->Value,&__rhs_01->Value);
                    if (!_Var28) {
                      this_05 = this_05 + 1;
                      JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator=(this_05,__rhs_01);
                    }
                  }
                  pJVar59 = this_05 + 1;
                }
              }
LAB_003b6a26:
              if (pJVar59 != (pointer)local_538._8_8_) {
                std::_Destroy<(anonymous_namespace)::JBT<std::__cxx11::string>*>
                          (pJVar59,(JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)local_538._8_8_);
                local_538._8_8_ = pJVar59;
              }
            }
            Json::Value::Value((Value *)&configFileDefines,objectValue);
            psVar31 = extraout_RDX_01;
            if (artifact._8_8_ != 0) {
              Json::Value::Value((Value *)&defines,(String *)&artifact);
              pVVar32 = Json::Value::operator[]((Value *)&configFileDefines,"language");
              Json::Value::operator=(pVVar32,(Value *)&defines);
              Json::Value::~Value((Value *)&defines);
              psVar31 = extraout_RDX_02;
            }
            if ((_Base_ptr)uStack_5a0 != (_Base_ptr)0x0) {
              DumpSysroot((Value *)&defines,(Target *)&artifact.limit_,psVar31);
              pVVar32 = Json::Value::operator[]((Value *)&configFileDefines,"sysroot");
              Json::Value::operator=(pVVar32,(Value *)&defines);
              Json::Value::~Value((Value *)&defines);
            }
            if (local_550._M_allocated_capacity != local_550._8_8_) {
              Json::Value::Value((Value *)&p,arrayValue);
              uVar51 = local_550._8_8_;
              for (uVar83 = local_550._M_allocated_capacity; uVar83 != uVar51;
                  uVar83 = (((Target *)uVar83)->TopSource).field_2._M_local_buf + 8) {
                obj_dir._M_dataplus._M_p = (pointer)&obj_dir.field_2;
                obj_dir._M_string_length = 0;
                obj_dir.field_2._M_allocated_capacity =
                     obj_dir.field_2._M_allocated_capacity & 0xffffffffffffff00;
                DumpCommandFragment((Value *)&defines,(Target *)uVar83,
                                    (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&obj_dir,&(_Var78._M_current)->Value);
                Json::Value::append((Value *)&p,(Value *)&defines);
                Json::Value::~Value((Value *)&defines);
                std::__cxx11::string::~string((string *)&obj_dir);
              }
              pVVar32 = Json::Value::operator[]
                                  ((Value *)&configFileDefines,"compileCommandFragments");
              Json::Value::operator=(pVVar32,(Value *)&p);
              Json::Value::~Value((Value *)&p);
            }
            if (local_508._M_allocated_capacity != local_508._8_8_) {
              Json::Value::Value((Value *)&p,arrayValue);
              uVar51 = local_508._8_8_;
              for (uVar83 = local_508._M_allocated_capacity; uVar83 != uVar51;
                  uVar83 = uVar83 + 0x30) {
                Json::Value::Value((Value *)&obj_dir,objectValue);
                Json::Value::Value((Value *)&defines,(String *)uVar83);
                pVVar32 = Json::Value::operator[]((Value *)&obj_dir,"path");
                Json::Value::operator=(pVVar32,(Value *)&defines);
                Json::Value::~Value((Value *)&defines);
                JVar30.Index = extraout_EDX;
                if (((pointer)uVar83)->IsSystem == true) {
                  Json::Value::Value((Value *)&defines,true);
                  pVVar32 = Json::Value::operator[]((Value *)&obj_dir,"isSystem");
                  Json::Value::operator=(pVVar32,(Value *)&defines);
                  Json::Value::~Value((Value *)&defines);
                  JVar30.Index = extraout_EDX_00;
                }
                AddBacktrace((Target *)&obj_dir,
                             (Value *)(ulong)(((pointer)uVar83)->Path).Backtrace.Index,JVar30);
                Json::Value::append((Value *)&p,(Value *)&obj_dir);
                Json::Value::~Value((Value *)&obj_dir);
              }
              pVVar32 = Json::Value::operator[]((Value *)&configFileDefines,"includes");
              Json::Value::operator=(pVVar32,(Value *)&p);
              Json::Value::~Value((Value *)&p);
            }
            if (local_538._0_8_ != local_538._8_8_) {
              Json::Value::Value((Value *)&p,arrayValue);
              uVar51 = local_538._8_8_;
              for (pJVar59 = (pointer)local_538._0_8_; pJVar59 != (pointer)uVar51;
                  pJVar59 = pJVar59 + 1) {
                Json::Value::Value((Value *)&obj_dir,objectValue);
                Json::Value::Value((Value *)&defines,&pJVar59->Value);
                pVVar32 = Json::Value::operator[]((Value *)&obj_dir,"define");
                Json::Value::operator=(pVVar32,(Value *)&defines);
                Json::Value::~Value((Value *)&defines);
                AddBacktrace((Target *)&obj_dir,(Value *)(ulong)(pJVar59->Backtrace).Index,bt);
                Json::Value::append((Value *)&p,(Value *)&obj_dir);
                Json::Value::~Value((Value *)&obj_dir);
              }
              pVVar32 = Json::Value::operator[]((Value *)&configFileDefines,"defines");
              Json::Value::operator=(pVVar32,(Value *)&p);
              Json::Value::~Value((Value *)&p);
            }
            if (local_520 != (undefined1  [8])_Stack_518._M_p) {
              Json::Value::Value((Value *)&p,arrayValue);
              _Var91._M_p = _Stack_518._M_p;
              for (auVar84 = local_520; auVar84 != (undefined1  [8])_Var91._M_p;
                  auVar84 = (undefined1  [8])
                            &(((BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)auVar84)->Backtraces).
                             super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>
                             ._M_impl.super__Vector_impl_data._M_finish) {
                Json::Value::Value((Value *)&obj_dir,objectValue);
                Json::Value::Value((Value *)&defines,(String *)auVar84);
                pVVar32 = Json::Value::operator[]((Value *)&obj_dir,"header");
                Json::Value::operator=(pVVar32,(Value *)&defines);
                Json::Value::~Value((Value *)&defines);
                AddBacktrace((Target *)&obj_dir,
                             (Value *)(ulong)*(uint *)&(((
                                                  BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)auVar84)->Backtraces).
                                                  super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,bt_00);
                Json::Value::append((Value *)&p,(Value *)&obj_dir);
                Json::Value::~Value((Value *)&obj_dir);
              }
              pVVar32 = Json::Value::operator[]((Value *)&configFileDefines,"precompileHeaders");
              Json::Value::operator=(pVVar32,(Value *)&p);
              Json::Value::~Value((Value *)&p);
            }
            if (local_588._8_8_ != 0) {
              Json::Value::Value((Value *)&obj_dir,objectValue);
              Json::Value::Value((Value *)&defines,(String *)&local_588);
              pVVar32 = Json::Value::operator[]((Value *)&obj_dir,"standard");
              Json::Value::operator=(pVVar32,(Value *)&defines);
              Json::Value::~Value((Value *)&defines);
              if ((_Base_ptr)local_568._M_nxt != p_Stack_560) {
                Json::Value::Value((Value *)&defines,arrayValue);
                p_Var38 = p_Stack_560;
                for (_Var85._M_nxt = local_568._M_nxt; (_Base_ptr)_Var85._M_nxt != p_Var38;
                    _Var85._M_nxt = (_Hash_node_base *)&(_Var85._M_nxt)->_M_nxt) {
                  Json::Value::Value((Value *)&p,
                                     *(UInt *)&(((_Vector_impl *)
                                                &((_Base_ptr)_Var85._M_nxt)->_M_color)->
                                               super__Vector_impl_data)._M_start);
                  Json::Value::append((Value *)&defines,(Value *)&p);
                  Json::Value::~Value((Value *)&p);
                }
                pVVar32 = Json::Value::operator[]((Value *)&obj_dir,"backtraces");
                Json::Value::operator=(pVVar32,(Value *)&defines);
                Json::Value::~Value((Value *)&defines);
              }
              pVVar32 = Json::Value::operator[]((Value *)&configFileDefines,"languageStandard");
              Json::Value::operator=(pVVar32,(Value *)&obj_dir);
              Json::Value::~Value((Value *)&obj_dir);
            }
            CompileData::~CompileData((CompileData *)&artifact);
            pVVar32 = Json::Value::operator[]((Value *)&configFileDefines,"sourceIndexes");
            Json::Value::operator=(pVVar32,&pCVar76->SourceIndexes);
            Json::Value::append(&compileGroups,(Value *)&configFileDefines);
            Json::Value::~Value((Value *)&configFileDefines);
            pCVar76 = pCVar76 + 1;
          } while( true );
        }
        value_00 = Json::Value::size(&local_2e0);
        Json::Value::Value(&local_238,objectValue);
        psVar31 = cmSourceFile::ResolveFullPath
                            (((BT<cmSourceFile_*> *)auStack_418._8_8_)->Value,(string *)0x0,
                             (string *)0x0);
        std::__cxx11::string::string((string *)&path,(string *)psVar31);
        cmSystemTools::RelativeIfUnder((string *)&defines,&this->TopSource,&path);
        Json::Value::Value(&artifact,(string *)&defines);
        pVVar32 = Json::Value::operator[](&local_238,"path");
        Json::Value::operator=(pVVar32,&artifact);
        Json::Value::~Value(&artifact);
        std::__cxx11::string::~string((string *)&defines);
        bVar27 = cmSourceFile::GetIsGenerated
                           (((BT<cmSourceFile_*> *)auStack_418._8_8_)->Value,GlobalAndLocal);
        if (bVar27) {
          Json::Value::Value(&artifact,true);
          pVVar32 = Json::Value::operator[](&local_238,"isGenerated");
          Json::Value::operator=(pVVar32,&artifact);
          Json::Value::~Value(&artifact);
        }
        AddBacktrace(this,&local_238,&((BT<cmSourceFile_*> *)auStack_418._8_8_)->Backtrace);
        pcVar53 = cmMakefile::FindSourceGroup(this->GT->Makefile,&path,&this->SourceGroupsLocal);
        if (pcVar53 != (cmSourceGroup *)0x0) {
          p._M_dataplus._M_p = (pointer)pcVar53;
          _Var54._M_cur =
               (__node_type *)
               std::
               _Hashtable<const_cmSourceGroup_*,_std::pair<const_cmSourceGroup_*const,_unsigned_int>,_std::allocator<std::pair<const_cmSourceGroup_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmSourceGroup_*>,_std::hash<const_cmSourceGroup_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(&(this->SourceGroupsMap)._M_h,(key_type *)&p);
          if (_Var54._M_cur == (__node_type *)0x0) {
            obj_dir._M_dataplus._M_p._0_4_ =
                 (int)(((long)(this->SourceGroups).
                              super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->SourceGroups).
                             super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x48);
            pVar96 = std::
                     _Hashtable<cmSourceGroup_const*,std::pair<cmSourceGroup_const*const,unsigned_int>,std::allocator<std::pair<cmSourceGroup_const*const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<cmSourceGroup_const*>,std::hash<cmSourceGroup_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                     ::_M_emplace<cmSourceGroup*&,unsigned_int&>
                               ((_Hashtable<cmSourceGroup_const*,std::pair<cmSourceGroup_const*const,unsigned_int>,std::allocator<std::pair<cmSourceGroup_const*const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<cmSourceGroup_const*>,std::hash<cmSourceGroup_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                                 *)&this->SourceGroupsMap,&p,&obj_dir);
            _Var54._M_cur =
                 (__node_type *)
                 pVar96.first.
                 super__Node_iterator_base<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false>
                 ._M_cur;
            artifact.value_.string_ = (char *)&artifact.comments_;
            artifact.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x0;
            artifact._12_4_ = 0;
            artifact.comments_.ptr_._M_t.
            super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            .
            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
            ._M_head_impl._0_1_ = 0;
            Json::Value::Value((Value *)&artifact.limit_,arrayValue);
            cmSourceGroup::GetFullName_abi_cxx11_((cmSourceGroup *)p._M_dataplus._M_p);
            std::__cxx11::string::_M_assign((string *)&artifact);
            pSVar56 = (this->SourceGroups).
                      super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (pSVar56 ==
                (this->SourceGroups).
                super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              __first_00 = (this->SourceGroups).
                           super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              lVar46 = (long)pSVar56 - (long)__first_00;
              if (lVar46 == 0x7ffffffffffffff8) {
                std::__throw_length_error("vector::_M_realloc_insert");
              }
              uVar67 = lVar46 / 0x48;
              __args_00 = (SourceGroup *)(lVar46 % 0x48);
              uVar80 = uVar67;
              if (pSVar56 == __first_00) {
                uVar80 = 1;
              }
              uVar94 = uVar80 + uVar67;
              __alloc_00 = (_Tp_alloc_type *)0x1c71c71c71c71c7;
              if (0x1c71c71c71c71c6 < uVar94) {
                uVar94 = 0x1c71c71c71c71c7;
              }
              if (CARRY8(uVar80,uVar67)) {
                uVar94 = 0x1c71c71c71c71c7;
              }
              if (uVar94 == 0) {
                __result = (pointer)0x0;
              }
              else {
                __result = (pointer)operator_new(uVar94 * 0x48);
                __args_00 = extraout_RDX;
              }
              std::allocator_traits<std::allocator<(anonymous_namespace)::Target::SourceGroup>>::
              construct<(anonymous_namespace)::Target::SourceGroup,(anonymous_namespace)::Target::SourceGroup>
                        ((allocator_type *)(__result + uVar67),(SourceGroup *)&artifact,__args_00);
              pSVar55 = std::
                        vector<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                        ::_S_relocate(__first_00,pSVar56,__result,__alloc_00);
              pSVar56 = std::
                        vector<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                        ::_S_relocate(pSVar56,pSVar56,pSVar55 + 1,__alloc_00);
              lVar46 = (long)(this->SourceGroups).
                             super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__first_00;
              std::
              _Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
              ::_M_deallocate((_Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                               *)__first_00,(pointer)(lVar46 / 0x48),lVar46 % 0x48);
              (this->SourceGroups).
              super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
              ._M_impl.super__Vector_impl_data._M_start = __result;
              (this->SourceGroups).
              super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
              ._M_impl.super__Vector_impl_data._M_finish = pSVar56;
              (this->SourceGroups).
              super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + uVar94;
            }
            else {
              std::allocator_traits<std::allocator<(anonymous_namespace)::Target::SourceGroup>>::
              construct<(anonymous_namespace)::Target::SourceGroup,(anonymous_namespace)::Target::SourceGroup>
                        ((allocator_type *)pSVar56,(SourceGroup *)&artifact,__args);
              ppSVar6 = &(this->SourceGroups).
                         super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppSVar6 = *ppSVar6 + 1;
            }
            SourceGroup::~SourceGroup((SourceGroup *)&artifact);
          }
          uVar9 = *(uint *)((long)&((_Var54._M_cur)->
                                   super__Hash_node_value<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false>
                                   ).
                                   super__Hash_node_value_base<std::pair<const_cmSourceGroup_*const,_unsigned_int>_>
                                   ._M_storage._M_storage + 8);
          pSVar82 = (this->SourceGroups).
                    super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          Json::Value::Value(&artifact,value_00);
          Json::Value::append(&pSVar82[uVar9].SourceIndexes,&artifact);
          Json::Value::~Value(&artifact);
          Json::Value::Value((Value *)&defines,
                             *(UInt *)((long)&((_Var54._M_cur)->
                                              super__Hash_node_value<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false>
                                              ).
                                              super__Hash_node_value_base<std::pair<const_cmSourceGroup_*const,_unsigned_int>_>
                                              ._M_storage._M_storage + 8));
          pVVar32 = Json::Value::operator[](&local_238,"sourceGroupIndex");
          Json::Value::operator=(pVVar32,(Value *)&defines);
          Json::Value::~Value((Value *)&defines);
        }
        if (*(SourceKind *)(auStack_418._8_8_ + 0x18) == SourceKindObjectSource) {
          pcVar74 = ((BT<cmSourceFile_*> *)auStack_418._8_8_)->Value;
          CompileData::CompileData((CompileData *)&artifact);
          local_4f0 = pcVar74;
          __k_00 = (CompileData *)cmSourceFile::GetOrDetermineLanguage_abi_cxx11_(pcVar74);
          std::__cxx11::string::_M_assign((string *)&artifact);
          if (artifact._8_8_ != 0) {
            pcVar33 = cmGeneratorTarget::GetLocalGenerator(this->GT);
            std::__cxx11::string::string((string *)&local_d0,(string *)this->Config);
            pcVar73 = this->GT;
            std::__cxx11::string::string((string *)&local_f0,(string *)&artifact);
            cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
                      ((cmGeneratorExpressionInterpreter *)&defines,pcVar33,&local_d0,pcVar73,
                       &local_f0);
            std::__cxx11::string::~string((string *)&local_f0);
            std::__cxx11::string::~string((string *)&local_d0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&COMPILE_FLAGS,"COMPILE_FLAGS",(allocator<char> *)&p);
            cVar36 = cmSourceFile::GetProperty(local_4f0,&COMPILE_FLAGS);
            if (cVar36.Value != (string *)0x0) {
              std::__cxx11::string::string((string *)&local_110,(string *)cVar36.Value);
              psVar31 = cmGeneratorExpressionInterpreter::Evaluate
                                  ((cmGeneratorExpressionInterpreter *)&defines,&local_110,
                                   &COMPILE_FLAGS);
              std::__cxx11::string::string((string *)&p,(string *)psVar31);
              std::__cxx11::string::~string((string *)&local_110);
              uVar51 = local_550._8_8_;
              obj_dir._M_dataplus._M_p._0_4_ = 0xffffffff;
              if ((undefined1  [8])local_550._8_8_ == local_540) {
                sVar71 = 1;
                p_Var58 = (_Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)std::
                             vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::_M_check_len((vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&local_550,1,"vector::_M_realloc_insert");
                uVar22 = local_550._8_8_;
                uVar83 = local_550._M_allocated_capacity;
                __result_00 = (Target *)
                              std::
                              _Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::_M_allocate(p_Var58,sVar71);
                std::
                allocator_traits<std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>::
                construct<(anonymous_namespace)::JBT<std::__cxx11::string>,std::__cxx11::string,(anonymous_namespace)::JBTIndex>
                          ((allocator_type *)((uVar51 - uVar83) + (long)__result_00),
                           (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&p,&obj_dir,(JBTIndex *)pcVar73);
                pJVar61 = std::
                          vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::_S_relocate((pointer)uVar83,(pointer)uVar51,(pointer)__result_00,
                                        (_Tp_alloc_type *)pcVar73);
                pTVar81 = (Target *)
                          std::
                          vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::_S_relocate((pointer)uVar51,(pointer)uVar22,pJVar61 + 1,
                                        (_Tp_alloc_type *)pcVar73);
                std::
                _Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::_M_deallocate((_Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)uVar83,(pointer)(((long)local_540 - uVar83) / 0x28),
                                ((long)local_540 - uVar83) % 0x28);
                local_540 = (undefined1  [8])((long)&__result_00->GT + (long)p_Var58 * 0x28);
                local_550._M_allocated_capacity = (size_type)__result_00;
              }
              else {
                std::
                allocator_traits<std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>::
                construct<(anonymous_namespace)::JBT<std::__cxx11::string>,std::__cxx11::string,(anonymous_namespace)::JBTIndex>
                          ((allocator_type *)local_550._8_8_,
                           (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&p,&obj_dir,(JBTIndex *)pcVar73);
                pTVar81 = (Target *)(local_550._8_8_ + 0x28);
              }
              local_550._8_8_ = pTVar81;
              std::__cxx11::string::~string((string *)&p);
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&COMPILE_OPTIONS,"COMPILE_OPTIONS",(allocator<char> *)&p);
            pBVar13 = (local_4f0->CompileOptions).
                      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (pBVar89 = (local_4f0->CompileOptions).
                           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; pBVar89 != pBVar13;
                pBVar89 = pBVar89 + 1) {
              BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
              BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&p,pBVar89);
              std::__cxx11::string::string((string *)&local_170,(string *)&p);
              cmGeneratorExpressionInterpreter::Evaluate
                        ((cmGeneratorExpressionInterpreter *)&defines,&local_170,&COMPILE_OPTIONS);
              std::__cxx11::string::_M_assign((string *)&p);
              std::__cxx11::string::~string((string *)&local_170);
              installGens.
              super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)&installGens.
                             super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
              installGens.
              super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              installGens.
              super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)((ulong)installGens.
                                    super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage &
                            0xffffffffffffff00);
              cmLocalGenerator::AppendCompileOptions(pcVar33,(string *)&installGens,&p,(char *)0x0);
              std::__cxx11::string::string((string *)&local_50,(string *)&installGens);
              std::
              __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ::__shared_ptr(&local_1a0,local_618);
              BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
              BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&obj_dir,&local_50,(cmListFileBacktrace *)&local_1a0);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_1a0._M_refcount);
              std::__cxx11::string::~string((string *)&local_50);
              (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                        ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&configFileDefines,this,
                         (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&obj_dir);
              std::
              vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
              ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>>
                        ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                          *)local_550._M_local_buf,
                         (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&configFileDefines);
              std::__cxx11::string::~string((string *)&configFileDefines);
              BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
              ~BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&obj_dir);
              std::__cxx11::string::~string((string *)&installGens);
              BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
              ~BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&p);
            }
            architectures.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            architectures.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            architectures.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            cmGeneratorTarget::GetAppleArchs(this->GT,this->Config,&architectures);
            if (architectures.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                architectures.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::emplace_back<>(&architectures);
            }
            pbVar25 = architectures.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pcVar74 = (cmSourceFile *)auStack_418;
            obj_dir._M_string_length = 1;
            obj_dir.field_2._M_allocated_capacity = 0;
            obj_dir.field_2._8_8_ = 0;
            auStack_418._0_8_ = (cmMakefile *)0x0;
            obj_dir._M_dataplus._M_p = (pointer)pcVar74;
            for (arch = architectures.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; arch != pbVar25; arch = arch + 1)
            {
              pcVar74 = (cmSourceFile *)&artifact;
              cmGeneratorTarget::GetPchSource
                        ((string *)&configFileDefines,this->GT,this->Config,(string *)pcVar74,arch);
              if (configFileDefines._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&p,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&configFileDefines,arch);
                std::
                _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                ::_M_emplace<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                            *)&obj_dir,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&p);
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&p);
              }
              std::__cxx11::string::~string((string *)&configFileDefines);
            }
            if (obj_dir.field_2._8_8_ != 0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&p,"SKIP_PRECOMPILE_HEADERS",
                         (allocator<char> *)&configFileDefines);
              cVar36 = cmSourceFile::GetProperty(local_4f0,&p);
              std::__cxx11::string::~string((string *)&p);
              if (cVar36.Value == (string *)0x0) {
                objectSources.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_start =
                     (pointer)&objectSources.
                               super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
                objectSources.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                objectSources.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)((ulong)objectSources.
                                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage &
                              0xffffffffffffff00);
                psVar31 = cmSourceFile::ResolveFullPath(local_4f0,(string *)0x0,(string *)0x0);
                iVar57 = std::
                         _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 *)&obj_dir,psVar31);
                if (iVar57.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                    ._M_cur == (__node_type *)0x0) {
                  configFileDefines._M_t._M_impl._0_8_ =
                       &configFileDefines._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                  configFileDefines._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                  configFileDefines._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                  configFileDefines._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                       (_Base_ptr)
                       ((ulong)configFileDefines._M_t._M_impl.super__Rb_tree_header._M_header.
                               _M_parent & 0xffffffffffffff00);
                  cmGeneratorTarget::GetPchUseCompileOptions
                            (&p,this->GT,this->Config,(string *)&artifact,
                             (string *)&configFileDefines);
                  std::__cxx11::string::operator=((string *)&objectSources,(string *)&p);
                  std::__cxx11::string::~string((string *)&p);
                  pBVar89 = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&configFileDefines;
                }
                else {
                  cmGeneratorTarget::GetPchCreateCompileOptions
                            (&p,this->GT,this->Config,(string *)&artifact,
                             (string *)
                             ((long)iVar57.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                    ._M_cur + 0x28));
                  std::__cxx11::string::operator=((string *)&objectSources,(string *)&p);
                  pBVar89 = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&p;
                }
                std::__cxx11::string::~string((string *)pBVar89);
                std::__cxx11::string::string((string *)&local_190,(string *)&objectSources);
                local_2b8.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)0x0;
                local_2b8.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_2b8);
                BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&p,&local_190,(cmListFileBacktrace *)&local_2b8);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&local_2b8.TopEntry.
                            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
                std::__cxx11::string::~string((string *)&local_190);
                std::__cxx11::string::string((string *)&local_130,(string *)&p);
                cmGeneratorExpressionInterpreter::Evaluate
                          ((cmGeneratorExpressionInterpreter *)&defines,&local_130,&COMPILE_OPTIONS)
                ;
                std::__cxx11::string::_M_assign((string *)&p);
                std::__cxx11::string::~string((string *)&local_130);
                tmp_1._M_dataplus._M_p = (pointer)&tmp_1.field_2;
                tmp_1._M_string_length = 0;
                tmp_1.field_2._M_local_buf[0] = '\0';
                pcVar74 = (cmSourceFile *)0x0;
                cmLocalGenerator::AppendCompileOptions(pcVar33,&tmp_1,&p,(char *)0x0);
                std::__cxx11::string::string((string *)&local_70,(string *)&tmp_1);
                std::
                __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ::__shared_ptr(&local_1b0,local_618);
                BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&configFileDefines,&local_70,(cmListFileBacktrace *)&local_1b0);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&local_1b0._M_refcount);
                std::__cxx11::string::~string((string *)&local_70);
                (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                          ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&installGens,this,
                           (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&configFileDefines);
                std::
                vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>>
                          ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                            *)local_550._M_local_buf,
                           (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&installGens);
                std::__cxx11::string::~string((string *)&installGens);
                BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&configFileDefines);
                std::__cxx11::string::~string((string *)&tmp_1);
                BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&p);
                std::__cxx11::string::~string((string *)&objectSources);
              }
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&objectSources,"INCLUDE_DIRECTORIES",(allocator<char> *)&p);
            pBVar14 = (BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)(local_4f0->IncludeDirectories).
                         super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
            pBVar47 = (BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)(local_4f0->IncludeDirectories).
                         super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            while (pBVar47 != pBVar14) {
              BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
              BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&p,(BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)pBVar47);
              std::__cxx11::string::string((string *)&tmp_1,(string *)&p);
              cmGeneratorExpressionInterpreter::Evaluate
                        ((cmGeneratorExpressionInterpreter *)&defines,&tmp_1,
                         (string *)&objectSources);
              std::__cxx11::string::_M_assign((string *)&p);
              std::__cxx11::string::~string((string *)&tmp_1);
              COMPILE_DEFINITIONS._M_dataplus._M_p = (pointer)0x0;
              COMPILE_DEFINITIONS._M_string_length = 0;
              COMPILE_DEFINITIONS.field_2._M_allocated_capacity = 0;
              pcVar74 = local_4f0;
              cmLocalGenerator::AppendIncludeDirectories
                        (pcVar33,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&COMPILE_DEFINITIONS,&p,local_4f0);
              sVar26 = COMPILE_DEFINITIONS._M_string_length;
              local_4e8 = (undefined1  [8])pBVar47;
              for (_Var91 = COMPILE_DEFINITIONS._M_dataplus; _Var91._M_p != (pointer)sVar26;
                  _Var91._M_p = _Var91._M_p + 0x20) {
                pcVar74 = (cmSourceFile *)&artifact;
                isSystemInclude =
                     cmGeneratorTarget::IsSystemIncludeDirectory
                               (this->GT,(string *)_Var91._M_p,this->Config,(string *)pcVar74);
                std::__cxx11::string::string((string *)&local_90,(string *)_Var91._M_p);
                std::
                __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ::__shared_ptr(&local_1c0,local_618);
                BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&configFileDefines,&local_90,(cmListFileBacktrace *)&local_1c0);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&local_1c0._M_refcount);
                std::__cxx11::string::~string((string *)&local_90);
                (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                          ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&installGens,this,
                           (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&configFileDefines);
                uVar51 = local_508._8_8_;
                if ((pointer)local_508._8_8_ == local_4f8._M_p) {
                  sVar71 = 1;
                  p_Var42 = (_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                             *)std::
                               vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                               ::_M_check_len((vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                                               *)&local_508,1,"vector::_M_realloc_insert");
                  uVar22 = local_508._8_8_;
                  uVar83 = local_508._M_allocated_capacity;
                  pIVar43 = std::
                            _Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                            ::_M_allocate(p_Var42,sVar71);
                  std::
                  allocator_traits<std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
                  ::
                  construct<(anonymous_namespace)::CompileData::IncludeEntry,(anonymous_namespace)::JBT<std::__cxx11::string>,bool_const&>
                            ((allocator_type *)((uVar51 - uVar83) + (long)pIVar43),
                             (IncludeEntry *)&installGens,
                             (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&isSystemInclude,(bool *)pcVar74);
                  pIVar45 = std::
                            vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                            ::_S_relocate((pointer)uVar83,(pointer)uVar51,pIVar43,
                                          (_Tp_alloc_type *)pcVar74);
                  pIVar45 = std::
                            vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                            ::_S_relocate((pointer)uVar51,(pointer)uVar22,pIVar45 + 1,
                                          (_Tp_alloc_type *)pcVar74);
                  pcVar74 = (cmSourceFile *)0x30;
                  std::
                  _Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                  ::_M_deallocate((_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                                   *)uVar83,(pointer)(((long)local_4f8._M_p - uVar83) / 0x30),
                                  ((long)local_4f8._M_p - uVar83) % 0x30);
                  local_4f8._M_p = (pointer)(pIVar43 + (long)p_Var42);
                  local_508._M_allocated_capacity = (size_type)pIVar43;
                }
                else {
                  std::
                  allocator_traits<std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
                  ::
                  construct<(anonymous_namespace)::CompileData::IncludeEntry,(anonymous_namespace)::JBT<std::__cxx11::string>,bool_const&>
                            ((allocator_type *)local_508._8_8_,(IncludeEntry *)&installGens,
                             (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&isSystemInclude,(bool *)pcVar74);
                  pIVar45 = (pointer)(local_508._8_8_ + 0x30);
                }
                local_508._8_8_ = pIVar45;
                std::__cxx11::string::~string((string *)&installGens);
                BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&configFileDefines);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&COMPILE_DEFINITIONS);
              BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
              ~BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&p);
              pBVar47 = (BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)((long)local_4e8 + 0x30);
            }
            std::__cxx11::string::~string((string *)&objectSources);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&COMPILE_DEFINITIONS,"COMPILE_DEFINITIONS",(allocator<char> *)&p);
            p._M_string_length._0_4_ = 0;
            p.field_2._M_allocated_capacity = 0;
            p.field_2._8_8_ = &p._M_string_length;
            local_618[0]._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            pBVar13 = (local_4f0->CompileDefinitions).
                      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            local_618[0]._M_ptr = (element_type *)p.field_2._8_8_;
            for (pBVar89 = (local_4f0->CompileDefinitions).
                           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; pBVar89 != pBVar13;
                pBVar89 = pBVar89 + 1) {
              BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
              BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&configFileDefines,pBVar89);
              std::__cxx11::string::string((string *)&isSystemInclude,(string *)&configFileDefines);
              cmGeneratorExpressionInterpreter::Evaluate
                        ((cmGeneratorExpressionInterpreter *)&defines,(string *)&isSystemInclude,
                         &COMPILE_DEFINITIONS);
              std::__cxx11::string::_M_assign((string *)&configFileDefines);
              std::__cxx11::string::~string((string *)&isSystemInclude);
              installGens.
              super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   (pointer)((ulong)installGens.
                                    super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000)
              ;
              installGens.
              super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              cmLocalGenerator::AppendDefines
                        (pcVar33,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&installGens,(string *)&configFileDefines);
              for (p_Var40 = (_Rb_tree_node_base *)
                             &installGens.
                              super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  p_Var40 !=
                  (_Rb_tree_node_base *)
                  &installGens.
                   super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
                  p_Var40 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var40)) {
                std::__cxx11::string::string((string *)&local_b0,(string *)(p_Var40 + 1));
                std::
                __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ::__shared_ptr(&local_1d0,
                               (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                *)&configFileDefines._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_right);
                BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&objectSources,&local_b0,(cmListFileBacktrace *)&local_1d0);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&local_1d0._M_refcount);
                std::__cxx11::string::~string((string *)&local_b0);
                std::
                _Rb_tree<BT<std::__cxx11::string>,BT<std::__cxx11::string>,std::_Identity<BT<std::__cxx11::string>>,std::less<BT<std::__cxx11::string>>,std::allocator<BT<std::__cxx11::string>>>
                ::_M_insert_unique<BT<std::__cxx11::string>const&>
                          ((_Rb_tree<BT<std::__cxx11::string>,BT<std::__cxx11::string>,std::_Identity<BT<std::__cxx11::string>>,std::less<BT<std::__cxx11::string>>,std::allocator<BT<std::__cxx11::string>>>
                            *)&p,(BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&objectSources);
                BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&objectSources);
              }
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&installGens);
              BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
              ~BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&configFileDefines);
            }
            configFileDefines._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 configFileDefines._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                 0xffffffff00000000;
            configFileDefines._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            configFileDefines._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &configFileDefines._M_t._M_impl.super__Rb_tree_header._M_header;
            configFileDefines._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            configFileDefines._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 configFileDefines._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            cmsys::SystemTools::UpperCase((string *)&installGens,this->Config);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &objectSources,"COMPILE_DEFINITIONS_",(string *)&installGens);
            std::__cxx11::string::~string((string *)&installGens);
            cVar36 = cmSourceFile::GetProperty
                               (local_4f0,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&objectSources);
            if (cVar36.Value != (string *)0x0) {
              std::__cxx11::string::string((string *)&local_1f0,(string *)cVar36.Value);
              psVar31 = cmGeneratorExpressionInterpreter::Evaluate
                                  ((cmGeneratorExpressionInterpreter *)&defines,&local_1f0,
                                   &COMPILE_DEFINITIONS);
              cmLocalGenerator::AppendDefines(pcVar33,&configFileDefines,psVar31);
              std::__cxx11::string::~string((string *)&local_1f0);
            }
            __k_00 = (CompileData *)
                     ((long)&(local_618[0]._M_refcount._M_pi)->_vptr__Sp_counted_base +
                     configFileDefines._M_t._M_impl.super__Rb_tree_header._M_node_count);
            std::
            vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::reserve((vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_538,(size_type)__k_00);
            for (uVar51 = p.field_2._8_8_;
                p_Var40 = configFileDefines._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                (size_type *)uVar51 != &p._M_string_length;
                uVar51 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar51)) {
              (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                        ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&installGens,this,
                         (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)(uVar51 + 0x20));
              __k_00 = (CompileData *)&installGens;
              std::
              vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
              ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>>
                        ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                          *)local_538,
                         (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&installGens);
              std::__cxx11::string::~string((string *)&installGens);
            }
            while( true ) {
              uVar51 = local_538._8_8_;
              if ((_Rb_tree_header *)p_Var40 ==
                  &configFileDefines._M_t._M_impl.super__Rb_tree_header) break;
              installGens.
              super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(installGens.
                                     super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
              __k_00 = (CompileData *)(p_Var40 + 1);
              if (local_538._8_8_ == local_538._16_8_) {
                sVar71 = 1;
                p_Var58 = (_Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)std::
                             vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::_M_check_len((vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)local_538,1,"vector::_M_realloc_insert");
                uVar22 = local_538._8_8_;
                uVar83 = local_538._0_8_;
                pJVar61 = (pointer)local_538._8_8_;
                pJVar59 = std::
                          _Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::_M_allocate(p_Var58,sVar71);
                std::
                allocator_traits<std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>::
                construct<(anonymous_namespace)::JBT<std::__cxx11::string>,std::__cxx11::string_const&,(anonymous_namespace)::JBTIndex>
                          ((allocator_type *)((uVar51 - uVar83) + (long)pJVar59),
                           (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)__k_00,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &installGens,(JBTIndex *)pJVar61);
                pJVar60 = std::
                          vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::_S_relocate((pointer)uVar83,(pointer)uVar51,pJVar59,
                                        (_Tp_alloc_type *)pJVar61);
                pJVar61 = std::
                          vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::_S_relocate((pointer)uVar51,(pointer)uVar22,pJVar60 + 1,
                                        (_Tp_alloc_type *)pJVar61);
                pcVar74 = (cmSourceFile *)&DAT_00000028;
                __k_00 = (CompileData *)((long)(local_538._16_8_ - uVar83) / 0x28);
                std::
                _Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::_M_deallocate((_Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)uVar83,(pointer)__k_00,(long)(local_538._16_8_ - uVar83) % 0x28);
                local_538._16_8_ = pJVar59 + (long)p_Var58;
                local_538._0_8_ = pJVar59;
                local_538._8_8_ = pJVar61;
              }
              else {
                std::
                allocator_traits<std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>::
                construct<(anonymous_namespace)::JBT<std::__cxx11::string>,std::__cxx11::string_const&,(anonymous_namespace)::JBTIndex>
                          ((allocator_type *)local_538._8_8_,
                           (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)__k_00,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &installGens,(JBTIndex *)pcVar74);
                local_538._8_8_ = (pointer)(local_538._8_8_ + 0x28);
              }
              p_Var40 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var40);
            }
            std::__cxx11::string::~string((string *)&objectSources);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree(&configFileDefines._M_t);
            std::
            _Rb_tree<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~_Rb_tree((_Rb_tree<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&p);
            std::__cxx11::string::~string((string *)&COMPILE_DEFINITIONS);
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)&obj_dir);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&architectures);
            std::__cxx11::string::~string((string *)&COMPILE_OPTIONS);
            std::__cxx11::string::~string((string *)&COMPILE_FLAGS);
            cmGeneratorExpressionInterpreter::~cmGeneratorExpressionInterpreter
                      ((cmGeneratorExpressionInterpreter *)&defines);
          }
          _Var62 = std::__detail::
                   _Hash_code_base<(anonymous_namespace)::CompileData,_std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_std::__detail::_Select1st,_std::hash<(anonymous_namespace)::CompileData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                   ::_M_hash_code((_Hash_code_base<(anonymous_namespace)::CompileData,_std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_std::__detail::_Select1st,_std::hash<(anonymous_namespace)::CompileData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                                   *)&artifact,__k_00);
          p_Var63 = std::
                    _Hashtable<(anonymous_namespace)::CompileData,_std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_std::allocator<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<(anonymous_namespace)::CompileData>,_std::hash<(anonymous_namespace)::CompileData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::_M_find_node(&this_01->_M_h,
                                   _Var62 % (this->CompileGroupMap)._M_h._M_bucket_count,
                                   (key_type *)&artifact,_Var62);
          if (p_Var63 == (__node_ptr)0x0) {
            pCVar76 = (this->CompileGroups).
                      super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pCVar15 = (this->CompileGroups).
                      super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            defines._M_t._M_impl._0_8_ = this_01;
            p_Var64 = (__node_ptr)operator_new(0xf0);
            _Var91._M_p = local_4f8._M_p;
            pJVar59 = local_510;
            uVar83 = local_538._16_8_;
            auVar84 = local_540;
            pJVar48 = local_558;
            uVar51 = local_588._8_8_;
            (p_Var64->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
            __key = &p_Var64->
                     super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
            ;
            puVar65 = (undefined8 *)
                      ((long)&(p_Var64->
                              super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                              ).
                              super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                              ._M_storage._M_storage + 0x10);
            *(undefined8 **)
             &(p_Var64->
              super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
              ).
              super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
              ._M_storage._M_storage = puVar65;
            __k = &artifact.comments_;
            if (artifact.value_ == __k) {
              *puVar65 = CONCAT71(artifact.comments_.ptr_._M_t.
                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                  .
                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                  ._M_head_impl._1_7_,
                                  artifact.comments_.ptr_._M_t.
                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                  .
                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                  ._M_head_impl._0_1_);
              *(ptrdiff_t *)
               ((long)&(p_Var64->
                       super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                       ).
                       super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                       ._M_storage._M_storage + 0x18) = artifact.start_;
            }
            else {
              (__key->
              super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
              )._M_storage._M_storage.__align =
                   (anon_struct_8_0_00000001_for___align)artifact.value_;
              *puVar65 = CONCAT71(artifact.comments_.ptr_._M_t.
                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                  .
                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                  ._M_head_impl._1_7_,
                                  artifact.comments_.ptr_._M_t.
                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                  .
                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                  ._M_head_impl._0_1_);
            }
            *(undefined8 *)
             ((long)&(p_Var64->
                     super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                     ._M_storage._M_storage + 8) = artifact._8_8_;
            artifact.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x0;
            artifact._12_4_ = 0;
            artifact.comments_.ptr_._M_t.
            super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            .
            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
            ._M_head_impl._0_1_ = 0;
            psVar1 = (size_type *)
                     ((long)&(p_Var64->
                             super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                             ).
                             super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                             ._M_storage._M_storage + 0x30);
            *(size_type **)
             ((long)&(p_Var64->
                     super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                     ._M_storage._M_storage + 0x20) = psVar1;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)artifact.limit_ == &local_598) {
              *psVar1 = local_598._M_allocated_capacity;
              *(undefined8 *)
               ((long)&(p_Var64->
                       super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                       ).
                       super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                       ._M_storage._M_storage + 0x38) = local_598._8_8_;
            }
            else {
              *(ptrdiff_t *)
               ((long)&(p_Var64->
                       super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                       ).
                       super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                       ._M_storage._M_storage + 0x20) = artifact.limit_;
              *(size_type *)
               ((long)&(p_Var64->
                       super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                       ).
                       super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                       ._M_storage._M_storage + 0x30) = local_598._M_allocated_capacity;
            }
            *(undefined8 *)
             ((long)&(p_Var64->
                     super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                     ._M_storage._M_storage + 0x28) = uStack_5a0;
            uStack_5a0 = (_Base_ptr)0x0;
            local_598._M_allocated_capacity = local_598._M_allocated_capacity & 0xffffffffffffff00;
            puVar65 = (undefined8 *)
                      ((long)&(p_Var64->
                              super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                              ).
                              super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                              ._M_storage._M_storage + 0x50);
            *(undefined8 **)
             ((long)&(p_Var64->
                     super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                     ._M_storage._M_storage + 0x40) = puVar65;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_588._0_8_ == &local_578) {
              *puVar65 = CONCAT71(local_578._M_allocated_capacity._1_7_,local_578._M_local_buf[0]);
              *(size_type *)
               ((long)&(p_Var64->
                       super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                       ).
                       super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                       ._M_storage._M_storage + 0x58) = local_578._8_8_;
            }
            else {
              *(undefined8 *)
               ((long)&(p_Var64->
                       super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                       ).
                       super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                       ._M_storage._M_storage + 0x40) = local_588._0_8_;
              *(ulong *)((long)&(p_Var64->
                                super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                                ).
                                super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                                ._M_storage._M_storage + 0x50) =
                   CONCAT71(local_578._M_allocated_capacity._1_7_,local_578._M_local_buf[0]);
            }
            local_588._8_8_ = 0;
            *(undefined8 *)
             ((long)&(p_Var64->
                     super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                     ._M_storage._M_storage + 0x48) = uVar51;
            local_578._M_local_buf[0] = '\0';
            *(_Hash_node_base **)
             ((long)&(p_Var64->
                     super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                     ._M_storage._M_storage + 0x60) = local_568._M_nxt;
            *(_Base_ptr *)
             ((long)&(p_Var64->
                     super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                     ._M_storage._M_storage + 0x68) = p_Stack_560;
            local_558 = (pointer)0x0;
            *(pointer *)
             ((long)&(p_Var64->
                     super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                     ._M_storage._M_storage + 0x70) = pJVar48;
            local_568._M_nxt = (_Hash_node_base *)0x0;
            p_Stack_560 = (_Base_ptr)0x0;
            *(size_type *)
             ((long)&(p_Var64->
                     super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                     ._M_storage._M_storage + 0x78) = local_550._M_allocated_capacity;
            *(undefined8 *)
             ((long)&(p_Var64->
                     super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                     ._M_storage._M_storage + 0x80) = local_550._8_8_;
            local_540 = (undefined1  [8])0x0;
            *(undefined1 (*) [8])
             ((long)&(p_Var64->
                     super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                     ._M_storage._M_storage + 0x88) = auVar84;
            local_550._M_allocated_capacity = 0;
            local_550._8_8_ = (Target *)0x0;
            *(undefined8 *)
             ((long)&(p_Var64->
                     super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                     ._M_storage._M_storage + 0x90) = local_538._0_8_;
            *(undefined8 *)
             ((long)&(p_Var64->
                     super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                     ._M_storage._M_storage + 0x98) = local_538._8_8_;
            local_538._16_8_ = (pointer)0x0;
            *(undefined8 *)
             ((long)&(p_Var64->
                     super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                     ._M_storage._M_storage + 0xa0) = uVar83;
            local_538._0_8_ = (pointer)0x0;
            local_538._8_8_ = (pointer)0x0;
            *(undefined1 (*) [8])
             ((long)&(p_Var64->
                     super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                     ._M_storage._M_storage + 0xa8) = local_520;
            *(pointer *)
             ((long)&(p_Var64->
                     super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                     ._M_storage._M_storage + 0xb0) = _Stack_518._M_p;
            local_510 = (pointer)0x0;
            *(pointer *)
             ((long)&(p_Var64->
                     super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                     ._M_storage._M_storage + 0xb8) = pJVar59;
            local_520 = (undefined1  [8])0x0;
            _Stack_518._M_p = (pointer)0x0;
            *(size_type *)
             ((long)&(p_Var64->
                     super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                     ._M_storage._M_storage + 0xc0) = local_508._M_allocated_capacity;
            *(undefined8 *)
             ((long)&(p_Var64->
                     super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                     ._M_storage._M_storage + 200) = local_508._8_8_;
            local_4f8._M_p = (pointer)0x0;
            *(pointer *)
             ((long)&(p_Var64->
                     super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                     ._M_storage._M_storage + 0xd0) = _Var91._M_p;
            local_508._M_allocated_capacity = 0;
            local_508._8_8_ = (pointer)0x0;
            *(int *)((long)&(p_Var64->
                            super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                            ._M_storage._M_storage + 0xd8) =
                 (int)(((long)pCVar76 - (long)pCVar15) / 0x30);
            artifact.value_ = (ValueHolder)__k;
            artifact.limit_ = (ptrdiff_t)&local_598;
            local_588._M_allocated_capacity = (size_type)&local_578;
            defines._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = p_Var64;
            _Var62 = std::__detail::
                     _Hash_code_base<(anonymous_namespace)::CompileData,_std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_std::__detail::_Select1st,_std::hash<(anonymous_namespace)::CompileData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                     ::_M_hash_code((_Hash_code_base<(anonymous_namespace)::CompileData,_std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_std::__detail::_Select1st,_std::hash<(anonymous_namespace)::CompileData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                                     *)__key,(CompileData *)__k);
            uVar80 = _Var62 % (this->CompileGroupMap)._M_h._M_bucket_count;
            p_Var63 = std::
                      _Hashtable<(anonymous_namespace)::CompileData,_std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_std::allocator<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<(anonymous_namespace)::CompileData>,_std::hash<(anonymous_namespace)::CompileData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::_M_find_node(&this_01->_M_h,uVar80,(key_type *)__key,_Var62);
            if (p_Var63 == (__node_ptr)0x0) {
              auVar97 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                                  ((ulong)&(this->CompileGroupMap)._M_h._M_rehash_policy,
                                   (this->CompileGroupMap)._M_h._M_bucket_count,
                                   (this->CompileGroupMap)._M_h._M_element_count);
              __n_00 = auVar97._8_8_;
              if ((auVar97 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                __s = (this_01->_M_h)._M_buckets;
              }
              else {
                if (__n_00 == 1) {
                  *pp_Var4 = (__node_base_ptr)0x0;
                  __s = pp_Var4;
                }
                else {
                  __s = std::allocator_traits<std::allocator<std::__detail::_Hash_node_base_*>_>::
                        allocate((allocator_type *)&p,__n_00);
                  memset(__s,0,__n_00 * 8);
                }
                _Var16._M_nxt = p_Var5->_M_nxt;
                p_Var5->_M_nxt = (_Hash_node_base *)0x0;
                uVar80 = 0;
LAB_003b5dd3:
                uVar67 = uVar80;
                _Var75._M_nxt = _Var16._M_nxt;
                if (_Var75._M_nxt != (_Hash_node_base *)0x0) {
                  _Var16._M_nxt = (_Var75._M_nxt)->_M_nxt;
                  uVar80 = (ulong)_Var75._M_nxt[0x1d]._M_nxt % __n_00;
                  if (__s[uVar80] == (_Hash_node_base *)0x0) goto LAB_003b5e07;
                  (_Var75._M_nxt)->_M_nxt = __s[uVar80]->_M_nxt;
                  pp_Var66 = &__s[uVar80]->_M_nxt;
                  uVar80 = uVar67;
                  goto LAB_003b5e26;
                }
                std::
                _Hashtable<(anonymous_namespace)::CompileData,_std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_std::allocator<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<(anonymous_namespace)::CompileData>,_std::hash<(anonymous_namespace)::CompileData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::_M_deallocate_buckets(&this_01->_M_h);
                (this->CompileGroupMap)._M_h._M_bucket_count = __n_00;
                (this->CompileGroupMap)._M_h._M_buckets = __s;
                uVar80 = _Var62 % __n_00;
              }
              (p_Var64->
              super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
              ).super__Hash_node_code_cache<true>._M_hash_code = _Var62;
              if (__s[uVar80] == (_Hash_node_base *)0x0) {
                p_Var17 = p_Var5->_M_nxt;
                (p_Var64->super__Hash_node_base)._M_nxt = p_Var17;
                p_Var5->_M_nxt = (_Hash_node_base *)p_Var64;
                if (p_Var17 != (_Hash_node_base *)0x0) {
                  __s[(ulong)p_Var17[0x1d]._M_nxt % (this->CompileGroupMap)._M_h._M_bucket_count] =
                       (__node_base_ptr)p_Var64;
                  __s = (this->CompileGroupMap)._M_h._M_buckets;
                }
                __s[uVar80] = p_Var5;
              }
              else {
                (p_Var64->super__Hash_node_base)._M_nxt = __s[uVar80]->_M_nxt;
                __s[uVar80]->_M_nxt = (_Hash_node_base *)p_Var64;
              }
              psVar7 = &(this->CompileGroupMap)._M_h._M_element_count;
              *psVar7 = *psVar7 + 1;
              defines._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              defines._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
              p_Var63 = p_Var64;
            }
            std::
            _Hashtable<(anonymous_namespace)::CompileData,_std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_std::allocator<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<(anonymous_namespace)::CompileData>,_std::hash<(anonymous_namespace)::CompileData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::_Scoped_node::~_Scoped_node((_Scoped_node *)&defines);
            defines._M_t._M_impl._0_8_ = 0;
            Json::Value::Value((Value *)&defines._M_t._M_impl.super__Rb_tree_header,arrayValue);
            pCVar69 = (this->CompileGroups).
                      super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            defines._M_t._M_impl._0_8_ = p_Var63;
            if (pCVar69 ==
                (this->CompileGroups).
                super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              __first_01 = (this->CompileGroups).
                           super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              lVar46 = (long)pCVar69 - (long)__first_01;
              if (lVar46 == 0x7fffffffffffffe0) {
                std::__throw_length_error("vector::_M_realloc_insert");
              }
              uVar67 = lVar46 / 0x30;
              __args_02 = (CompileGroup *)(lVar46 % 0x30);
              uVar80 = uVar67;
              if (pCVar69 == __first_01) {
                uVar80 = 1;
              }
              uVar94 = uVar80 + uVar67;
              __alloc_01 = (_Tp_alloc_type *)0x2aaaaaaaaaaaaaa;
              if (0x2aaaaaaaaaaaaa9 < uVar94) {
                uVar94 = 0x2aaaaaaaaaaaaaa;
              }
              if (CARRY8(uVar80,uVar67)) {
                uVar94 = 0x2aaaaaaaaaaaaaa;
              }
              if (uVar94 == 0) {
                __result_01 = (pointer)0x0;
              }
              else {
                __result_01 = (pointer)operator_new(uVar94 * 0x30);
                __args_02 = extraout_RDX_00;
              }
              std::allocator_traits<std::allocator<(anonymous_namespace)::Target::CompileGroup>>::
              construct<(anonymous_namespace)::Target::CompileGroup,(anonymous_namespace)::Target::CompileGroup>
                        ((allocator_type *)(__result_01 + uVar67),(CompileGroup *)&defines,__args_02
                        );
              pCVar68 = std::
                        vector<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                        ::_S_relocate(__first_01,pCVar69,__result_01,__alloc_01);
              pCVar69 = std::
                        vector<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                        ::_S_relocate(pCVar69,pCVar69,pCVar68 + 1,__alloc_01);
              lVar46 = (long)(this->CompileGroups).
                             super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__first_01;
              std::
              _Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
              ::_M_deallocate((_Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                               *)__first_01,(pointer)(lVar46 / 0x30),lVar46 % 0x30);
              (this->CompileGroups).
              super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
              ._M_impl.super__Vector_impl_data._M_start = __result_01;
              (this->CompileGroups).
              super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
              ._M_impl.super__Vector_impl_data._M_finish = pCVar69;
              (this->CompileGroups).
              super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = __result_01 + uVar94;
            }
            else {
              std::allocator_traits<std::allocator<(anonymous_namespace)::Target::CompileGroup>>::
              construct<(anonymous_namespace)::Target::CompileGroup,(anonymous_namespace)::Target::CompileGroup>
                        ((allocator_type *)pCVar69,(CompileGroup *)&defines,__args_01);
              ppCVar8 = &(this->CompileGroups).
                         super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppCVar8 = *ppCVar8 + 1;
            }
            Json::Value::~Value((Value *)&defines._M_t._M_impl.super__Rb_tree_header);
          }
          uVar9 = *(uint *)((long)&(p_Var63->
                                   super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                                   ).
                                   super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                                   ._M_storage._M_storage + 0xd8);
          pCVar76 = (this->CompileGroups).
                    super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          Json::Value::Value((Value *)&defines,value_00);
          Json::Value::append(&pCVar76[uVar9].SourceIndexes,(Value *)&defines);
          Json::Value::~Value((Value *)&defines);
          value = *(UInt *)((long)&(p_Var63->
                                   super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                                   ).
                                   super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                                   ._M_storage._M_storage + 0xd8);
          CompileData::~CompileData((CompileData *)&artifact);
          Json::Value::Value(&compileGroups,value);
          pVVar32 = Json::Value::operator[](&local_238,"compileGroupIndex");
          Json::Value::operator=(pVVar32,&compileGroups);
          Json::Value::~Value(&compileGroups);
        }
        std::__cxx11::string::~string((string *)&path);
        Json::Value::append(&local_2e0,&local_238);
        Json::Value::~Value(&local_238);
        auStack_418._8_8_ = auStack_418._8_8_ + 0x20;
      } while( true );
    }
    paVar88 = &(((cmSourceFile *)uVar51)->Location).Directory.field_2;
    local_4f0 = (cmSourceFile *)uVar51;
    iVar39 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
             ::lower_bound(this_00,(key_type *)paVar88);
    pVar20.second = iVar39._M_node;
    pVar20.first = iVar39._M_node;
    if (((_Rb_tree_header *)iVar39._M_node == p_Var2) ||
       (bVar27 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )paVar88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)(iVar39._M_node + 1)), bVar27)) {
      p_Var40 = (_Rb_tree_node_base *)operator_new(0x118);
      __rhs = (_Link_type)(p_Var40 + 1);
      std::__cxx11::string::string((string *)__rhs,(string *)paVar88->_M_local_buf);
      memset((CompileData *)(p_Var40 + 2),0,0xd8);
      CompileData::CompileData((CompileData *)(p_Var40 + 2));
      if ((_Rb_tree_header *)iVar39._M_node == p_Var2) {
        if (((this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
           (__p = __rhs,
           bVar27 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header.
                                       _M_header._M_right + 1),
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)__rhs), !bVar27)) {
LAB_003b409a:
          __p = __rhs;
          pVar95 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
                   ::_M_get_insert_unique_pos(&this_00->_M_t,(key_type *)__rhs);
        }
        else {
          p_Var79 = (this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
LAB_003b40af:
          auVar97._8_8_ = 0;
          auVar97._0_8_ = p_Var79;
          pVar95 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar97 << 0x40);
        }
LAB_003b40b2:
        iVar39._M_node = pVar95.first;
        if (pVar95.second == (_Rb_tree_node_base *)0x0) {
LAB_003b40df:
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
          ::_M_drop_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
                          *)p_Var40,__p);
          goto LAB_003b410e;
        }
      }
      else {
        __rhs_00 = (_Link_type)(iVar39._M_node + 1);
        __p = __rhs_00;
        bVar27 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__rhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)__rhs_00);
        if (!bVar27) {
          __p = __rhs;
          bVar27 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__rhs_00,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__rhs);
          if (bVar27) {
            p_Var79 = (this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
            if (p_Var79 == iVar39._M_node) goto LAB_003b40af;
            p_Var41 = (_Rb_tree_node_base *)std::_Rb_tree_increment(iVar39._M_node);
            pVar95.second = p_Var41;
            pVar95.first = p_Var41;
            __p = (_Link_type)(p_Var41 + 1);
            bVar27 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__rhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)__p);
            if (!bVar27) goto LAB_003b409a;
            if ((iVar39._M_node)->_M_right == (_Base_ptr)0x0) goto LAB_003b4095;
            goto LAB_003b40b2;
          }
          goto LAB_003b40df;
        }
        p_Var79 = (this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        pVar95.second = p_Var79;
        pVar95.first = p_Var79;
        if (p_Var79 == iVar39._M_node) goto LAB_003b40b2;
        iVar39._M_node = (_Base_ptr)std::_Rb_tree_decrement(iVar39._M_node);
        __p = __rhs;
        bVar27 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(iVar39._M_node + 1),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__rhs);
        if (!bVar27) goto LAB_003b409a;
        pVar95 = pVar20;
        if ((iVar39._M_node)->_M_right != (_Base_ptr)0x0) goto LAB_003b40b2;
LAB_003b4095:
        auVar21._8_8_ = 0;
        auVar21._0_8_ = iVar39._M_node;
        pVar95 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar21 << 0x40);
      }
      p_Var41 = pVar95.second;
      bVar27 = true;
      if ((p_Var2 != (_Rb_tree_header *)p_Var41) && (pVar95.first == (_Rb_tree_node_base *)0x0)) {
        bVar27 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__rhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(p_Var41 + 1));
      }
      std::_Rb_tree_insert_and_rebalance(bVar27,p_Var40,p_Var41,&p_Var2->_M_header);
      psVar3 = &(this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      *psVar3 = *psVar3 + 1;
      iVar39._M_node = p_Var40;
    }
LAB_003b410e:
    std::__cxx11::string::_M_assign((string *)(iVar39._M_node + 2));
    pcVar10 = this->GT->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&artifact,"CMAKE_SYSROOT_COMPILE",(allocator<char> *)&defines);
    cVar36 = cmMakefile::GetDefinition(pcVar10,(string *)&artifact);
    std::__cxx11::string::~string((string *)&artifact);
    if (cVar36.Value == (string *)0x0) {
      pcVar10 = this->GT->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&artifact,"CMAKE_SYSROOT",(allocator<char> *)&defines);
      cVar36 = cmMakefile::GetDefinition(pcVar10,(string *)&artifact);
      std::__cxx11::string::~string((string *)&artifact);
      if (cVar36.Value != (string *)0x0) goto LAB_003b41a7;
    }
    else {
LAB_003b41a7:
      std::__cxx11::string::_M_assign((string *)(iVar39._M_node + 3));
    }
    pcVar33 = cmGeneratorTarget::GetLocalGenerator(this->GT);
    artifact.value_.string_ = (char *)&artifact.comments_;
    artifact.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x0;
    artifact._12_4_ = 0;
    artifact.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl._0_1_ = 0;
    cmLocalGenerator::GetTargetCompileFlags
              ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&defines,pcVar33,this->GT,this->Config,(string *)paVar88,(string *)&artifact);
    std::__cxx11::string::~string((string *)&artifact);
    std::
    vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::reserve((vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&iVar39._M_node[5]._M_right,
              (long)(defines._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ -
                    defines._M_t._M_impl._0_8_) / 0x30);
    uVar51 = defines._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
    for (pBVar89 = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)defines._M_t._M_impl._0_8_;
        pBVar89 !=
        (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        uVar51; pBVar89 = pBVar89 + 1) {
      (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&artifact,this,pBVar89);
      std::
      vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
      ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>>
                ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                  *)&iVar39._M_node[5]._M_right,
                 (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&artifact);
      std::__cxx11::string::~string((string *)&artifact);
    }
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&defines);
    cmLocalGenerator::GetTargetDefines(&defines,pcVar33,this->GT,this->Config,(string *)paVar88);
    std::
    vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::reserve((vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&iVar39._M_node[6]._M_left,defines._M_t._M_impl.super__Rb_tree_header._M_node_count
             );
    for (p_Var38 = defines._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var38 != &defines._M_t._M_impl.super__Rb_tree_header;
        p_Var38 = (_Base_ptr)std::_Rb_tree_increment(p_Var38)) {
      (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&artifact,this,
                 (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(p_Var38 + 1));
      std::
      vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
      ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>>
                ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                  *)&iVar39._M_node[6]._M_left,
                 (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&artifact);
      std::__cxx11::string::~string((string *)&artifact);
    }
    cmLocalGenerator::GetIncludeDirectories
              ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&objectSources,pcVar33,this->GT,(string *)paVar88,this->Config);
    ppcVar24 = objectSources.
               super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    local_4e8 = (undefined1  [8])(iVar39._M_node + 8);
    for (pBVar89 = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)objectSources.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        pBVar89 !=
        (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        ppcVar24; pBVar89 = pBVar89 + 1) {
      (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&artifact,this,pBVar89);
      __alloc = (_Tp_alloc_type *)paVar88;
      bVar27 = cmGeneratorTarget::IsSystemIncludeDirectory
                         (this->GT,&pBVar89->Value,this->Config,(string *)paVar88);
      obj_dir._M_dataplus._M_p._0_1_ = bVar27;
      pIVar45 = (pointer)iVar39._M_node[8]._M_parent;
      if (pIVar45 == (pointer)iVar39._M_node[8]._M_left) {
        sVar71 = 1;
        p_Var42 = (_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                   *)std::
                     vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                     ::_M_check_len((vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                                     *)local_4e8,1,"vector::_M_realloc_insert");
        __first = *(pointer *)(iVar39._M_node + 8);
        __last = (pointer)iVar39._M_node[8]._M_parent;
        pIVar43 = std::
                  _Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                  ::_M_allocate(p_Var42,sVar71);
        std::allocator_traits<std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>::
        construct<(anonymous_namespace)::CompileData::IncludeEntry,(anonymous_namespace)::JBT<std::__cxx11::string>,bool>
                  ((allocator_type *)(((long)pIVar45 - (long)__first) + (long)pIVar43),
                   (IncludeEntry *)&artifact,
                   (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&obj_dir,(bool *)__alloc);
        pIVar44 = std::
                  vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                  ::_S_relocate(__first,pIVar45,pIVar43,__alloc);
        pIVar45 = std::
                  vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                  ::_S_relocate(pIVar45,__last,pIVar44 + 1,__alloc);
        lVar46 = (long)iVar39._M_node[8]._M_left - (long)__first;
        std::
        _Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
        ::_M_deallocate((_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                         *)__first,(pointer)(lVar46 / 0x30),lVar46 % 0x30);
        *(pointer *)(iVar39._M_node + 8) = pIVar43;
        iVar39._M_node[8]._M_left = (_Base_ptr)(pIVar43 + (long)p_Var42);
      }
      else {
        std::allocator_traits<std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>::
        construct<(anonymous_namespace)::CompileData::IncludeEntry,(anonymous_namespace)::JBT<std::__cxx11::string>,bool>
                  ((allocator_type *)pIVar45,(IncludeEntry *)&artifact,
                   (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&obj_dir,(bool *)__alloc);
        pIVar45 = (pointer)&iVar39._M_node[8]._M_parent[1]._M_left;
      }
      iVar39._M_node[8]._M_parent = (_Base_ptr)pIVar45;
      std::__cxx11::string::~string((string *)&artifact);
    }
    cmGeneratorTarget::GetPrecompileHeaders
              ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&compileGroups,this->GT,this->Config,(string *)paVar88);
    uVar51 = compileGroups._8_8_;
    for (bt_01 = compileGroups.value_; bt_01.int_ != uVar51;
        bt_01.string_ = (char *)(bt_01.int_ + 0x30)) {
      (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&artifact,this,
                 (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)bt_01.map_);
      std::
      vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
      ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>>
                ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                  *)&iVar39._M_node[7]._M_parent,
                 (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&artifact);
      std::__cxx11::string::~string((string *)&artifact);
    }
    pBVar47 = cmGeneratorTarget::GetLanguageStandardProperty
                        (this->GT,(string *)paVar88,this->Config);
    if (pBVar47 !=
        (BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)0x0
       ) {
      configFileDefines._M_t._M_impl._0_8_ = 0;
      configFileDefines._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      configFileDefines._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      configFileDefines._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      pcVar11 = (pBVar47->Backtraces).
                super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      p_Var38 = (_Base_ptr)0x0;
      p_Var90 = (_Base_ptr)0x0;
      local_4e8 = (undefined1  [8])pBVar47;
      for (bt_02 = (pBVar47->Backtraces).
                   super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar51 = configFileDefines._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,
          bt_02 != pcVar11; bt_02 = bt_02 + 1) {
        __n_03 = bt_02;
        JVar30 = BacktraceData::Add(&this->Backtraces,bt_02);
        if ((_Base_ptr)uVar51 == p_Var38) {
          lVar46 = (long)p_Var38 - (long)p_Var90;
          if (lVar46 == 0x7ffffffffffffffc) {
            configFileDefines._M_t._M_impl._0_8_ = p_Var90;
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          __p_00 = (pointer)(lVar46 >> 2);
          pJVar48 = __p_00;
          if (p_Var38 == p_Var90) {
            pJVar48 = (pointer)&DAT_00000001;
          }
          this_06 = (_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                     *)((long)&__p_00->Index + (long)&pJVar48->Index);
          if ((_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
               *)0x1ffffffffffffffe < this_06) {
            this_06 = (_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                       *)0x1fffffffffffffff;
          }
          if (CARRY8((ulong)pJVar48,(ulong)__p_00)) {
            this_06 = (_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                       *)0x1fffffffffffffff;
          }
          p_Var49 = (_Base_ptr)
                    std::
                    _Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                    ::_M_allocate(this_06,(size_t)__n_03);
          *(ArrayIndex *)((long)p_Var49 + lVar46) = JVar30.Index;
          p_Var70 = p_Var49;
          for (p_Var50 = p_Var90; puVar86 = &p_Var70->field_0x4, p_Var50 != p_Var38;
              p_Var50 = (_Base_ptr)&p_Var50->field_0x4) {
            *(ArrayIndex *)&(((_Vector_impl *)&p_Var70->_M_color)->super__Vector_impl_data)._M_start
                 = *(ArrayIndex *)
                    &(((_Vector_impl *)&p_Var50->_M_color)->super__Vector_impl_data)._M_start;
            p_Var70 = (_Base_ptr)puVar86;
          }
          std::
          _Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
          ::_M_deallocate((_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                           *)p_Var90,__p_00,__n);
          p_Var38 = (_Base_ptr)
                    ((long)&(((_Vector_impl *)&p_Var49->_M_color)->super__Vector_impl_data)._M_start
                    + (long)this_06 * 4);
          configFileDefines._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var38;
        }
        else {
          *(ArrayIndex *)uVar51 = JVar30.Index;
          puVar86 = (undefined1 *)(uVar51 + 4);
          p_Var49 = p_Var90;
        }
        p_Var90 = p_Var49;
        configFileDefines._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = puVar86;
      }
      auVar84 = local_4e8;
      configFileDefines._M_t._M_impl._0_8_ = p_Var90;
      std::__cxx11::string::string((string *)&obj_dir,(string *)local_4e8);
      installGens.
      super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      installGens.
      super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)std::
                    _Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                    ::_M_allocate((_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                                   *)(uVar51 - (long)p_Var90 >> 2),(size_t)auVar84);
      installGens.
      super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((uVar51 - (long)p_Var90) +
                    (long)installGens.
                          super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      installGens.
      super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           installGens.
           super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
           ._M_impl.super__Vector_impl_data._M_start;
      for (; p_Var90 != (_Base_ptr)uVar51; p_Var90 = (_Base_ptr)&p_Var90->field_0x4) {
        ((pointer)
        installGens.
        super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>.
        _M_impl.super__Vector_impl_data._M_finish)->Index =
             *(ArrayIndex *)
              &(((_Vector_impl *)&p_Var90->_M_color)->super__Vector_impl_data)._M_start;
        installGens.
        super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             (pointer)((long)installGens.
                             super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 4);
      }
      JBTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::JBTs
                ((JBTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&artifact,&obj_dir,
                 (vector<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                  *)&installGens);
      std::
      _Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
      ::~_Vector_base((_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                       *)&installGens);
      std::__cxx11::string::~string((string *)&obj_dir);
      std::
      _Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
      ::~_Vector_base((_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                       *)&configFileDefines);
      std::__cxx11::string::operator=((string *)(iVar39._M_node + 4),(string *)&artifact);
      obj_dir.field_2._M_allocated_capacity = (size_type)iVar39._M_node[5]._M_left;
      iVar39._M_node[5]._M_left = (_Base_ptr)local_598._M_allocated_capacity;
      obj_dir._M_dataplus._M_p = *(pointer *)(iVar39._M_node + 5);
      obj_dir._M_string_length = (size_type)iVar39._M_node[5]._M_parent;
      *(ptrdiff_t *)(iVar39._M_node + 5) = artifact.limit_;
      iVar39._M_node[5]._M_parent = (_Base_ptr)uStack_5a0;
      artifact.limit_ = 0;
      uStack_5a0 = (_Base_ptr)0x0;
      local_598._M_allocated_capacity = 0;
      std::
      _Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
      ::~_Vector_base((_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                       *)&obj_dir);
      JBTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~JBTs
                ((JBTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&artifact);
    }
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&compileGroups);
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&objectSources);
    std::
    _Rb_tree<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&defines._M_t);
    uVar51 = std::_Rb_tree_increment((_Rb_tree_node_base *)local_4f0);
  } while( true );
code_r0x003b6922:
  bVar27 = __buffer_size == (pointer)&DAT_00000001;
  _Var78._M_current =
       (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)0x0;
  __buffer_size =
       (pointer)((ulong)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&__buffer_size->Entry)->_M_dataplus)._M_p + 1) >> 1);
  if (bVar27) {
    __buffer_size = (pointer)0x0;
  }
  goto LAB_003b6905;
LAB_003b5e07:
  (_Var75._M_nxt)->_M_nxt = p_Var5->_M_nxt;
  p_Var5->_M_nxt = _Var75._M_nxt;
  __s[uVar80] = p_Var5;
  if ((_Var75._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
    pp_Var66 = __s + uVar67;
LAB_003b5e26:
    *pp_Var66 = _Var75._M_nxt;
  }
  goto LAB_003b5dd3;
}

Assistant:

Json::Value Target::Dump()
{
  Json::Value target = Json::objectValue;

  cmStateEnums::TargetType const type = this->GT->GetType();

  target["name"] = this->GT->GetName();
  target["type"] = cmState::GetTargetTypeName(type);
  target["id"] = TargetId(this->GT, this->TopBuild);
  target["paths"] = this->DumpPaths();
  if (this->GT->Target->GetIsGeneratorProvided()) {
    target["isGeneratorProvided"] = true;
  }

  this->AddBacktrace(target, this->GT->GetBacktrace());

  if (this->GT->Target->GetHaveInstallRule()) {
    target["install"] = this->DumpInstall();
  }

  if (this->GT->HaveWellDefinedOutputFiles()) {
    Json::Value artifacts = this->DumpArtifacts();
    if (!artifacts.empty()) {
      target["artifacts"] = std::move(artifacts);
    }
  }

  if (type == cmStateEnums::EXECUTABLE ||
      type == cmStateEnums::SHARED_LIBRARY ||
      type == cmStateEnums::MODULE_LIBRARY) {
    target["nameOnDisk"] = this->GT->GetFullName(this->Config);
    target["link"] = this->DumpLink();
  } else if (type == cmStateEnums::STATIC_LIBRARY) {
    target["nameOnDisk"] = this->GT->GetFullName(this->Config);
    target["archive"] = this->DumpArchive();
  }

  Json::Value dependencies = this->DumpDependencies();
  if (!dependencies.empty()) {
    target["dependencies"] = dependencies;
  }

  {
    this->ProcessLanguages();

    target["sources"] = this->DumpSources();

    Json::Value folder = this->DumpFolder();
    if (!folder.isNull()) {
      target["folder"] = std::move(folder);
    }

    Json::Value sourceGroups = this->DumpSourceGroups();
    if (!sourceGroups.empty()) {
      target["sourceGroups"] = std::move(sourceGroups);
    }

    Json::Value compileGroups = this->DumpCompileGroups();
    if (!compileGroups.empty()) {
      target["compileGroups"] = std::move(compileGroups);
    }
  }

  target["backtraceGraph"] = this->Backtraces.Dump();

  return target;
}